

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLap_3D_K.H
# Opt level: O0

void amrex::mlndlap_bc_doit<double>
               (Box *vbx,Array4<double> *a,Box *domain,GpuArray<bool,_3U> *bflo,
               GpuArray<bool,_3U> *bfhi)

{
  undefined8 uVar1;
  bool bVar2;
  byte *in_RCX;
  Box *in_RDX;
  long *in_RSI;
  Box *in_RDI;
  byte *in_R8;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Box result;
  Box *sbox;
  Dim3 dhi;
  Dim3 dlo;
  int offset;
  int idim;
  Box gdomain;
  IntVect local_2150;
  int local_2144;
  int local_2140;
  int local_213c;
  undefined8 local_2138;
  int local_2130;
  undefined8 local_2124;
  int local_211c;
  int local_2118 [2];
  int local_2110;
  int local_2108;
  int iStack_2104;
  int local_2100;
  Box local_20f8;
  Box *local_20d8;
  undefined8 local_20d0;
  int local_20c8;
  undefined8 local_20c0;
  int local_20b8;
  undefined8 local_20b0;
  int local_20a8;
  undefined8 local_20a0;
  int local_2098;
  uint local_2094;
  int local_2090;
  Box local_208c;
  byte *local_2070;
  byte *local_2068;
  Box *local_2060;
  long *local_2058;
  Box *local_2050;
  int local_2048 [2];
  int local_2040;
  Box *local_2038;
  int local_202c;
  int iStack_2028;
  int local_2024;
  undefined8 local_2020;
  int local_2018;
  Box *local_2010;
  int local_2004;
  int iStack_2000;
  int local_1ffc;
  undefined8 local_1ff8;
  int local_1ff0;
  Box *local_1fe8;
  int local_1fdc;
  int iStack_1fd8;
  int local_1fd4;
  undefined8 local_1fd0;
  int local_1fc8;
  Box *local_1fc0;
  int local_1fb8;
  int iStack_1fb4;
  int local_1fb0;
  int local_1fac;
  int local_1fa8;
  int local_1fa4;
  long *local_1fa0;
  int local_1f94;
  int local_1f90;
  int local_1f8c;
  long *local_1f88;
  int local_1f7c;
  int local_1f78;
  int local_1f74;
  long *local_1f70;
  int local_1f64;
  int local_1f60;
  int local_1f5c;
  long *local_1f58;
  int local_1f4c;
  int local_1f48;
  int local_1f44;
  long *local_1f40;
  int local_1f34;
  int local_1f30;
  int local_1f2c;
  long *local_1f28;
  int local_1f1c;
  int local_1f18;
  int local_1f14;
  long *local_1f10;
  int local_1f04;
  int local_1f00;
  int local_1efc;
  long *local_1ef8;
  int local_1eec;
  int local_1ee8;
  int local_1ee4;
  long *local_1ee0;
  int local_1ed4;
  int local_1ed0;
  int local_1ecc;
  long *local_1ec8;
  int local_1ebc;
  int local_1eb8;
  int local_1eb4;
  long *local_1eb0;
  int local_1ea4;
  int local_1ea0;
  int local_1e9c;
  long *local_1e98;
  int local_1e8c;
  int local_1e88;
  int local_1e84;
  long *local_1e80;
  int local_1e74;
  int local_1e70;
  int local_1e6c;
  long *local_1e68;
  int local_1e5c;
  int local_1e58;
  int local_1e54;
  long *local_1e50;
  int local_1e44;
  int local_1e40;
  int local_1e3c;
  long *local_1e38;
  int local_1e2c;
  int local_1e28;
  int local_1e24;
  long *local_1e20;
  int local_1e14;
  int local_1e10;
  int local_1e0c;
  long *local_1e08;
  int local_1dfc;
  int local_1df8;
  int local_1df4;
  long *local_1df0;
  int local_1de4;
  int local_1de0;
  int local_1ddc;
  long *local_1dd8;
  int local_1dcc;
  int local_1dc8;
  int local_1dc4;
  long *local_1dc0;
  int local_1db4;
  int local_1db0;
  int local_1dac;
  long *local_1da8;
  int local_1d9c;
  int local_1d98;
  int local_1d94;
  long *local_1d90;
  int local_1d84;
  int local_1d80;
  int local_1d7c;
  long *local_1d78;
  int local_1d6c;
  int local_1d68;
  int local_1d64;
  long *local_1d60;
  int local_1d54;
  int local_1d50;
  int local_1d4c;
  long *local_1d48;
  int local_1d3c;
  int local_1d38;
  int local_1d34;
  long *local_1d30;
  int local_1d24;
  int local_1d20;
  int local_1d1c;
  long *local_1d18;
  int local_1d0c;
  int local_1d08;
  int local_1d04;
  long *local_1d00;
  int local_1cf4;
  int local_1cf0;
  int local_1cec;
  long *local_1ce8;
  int local_1cdc;
  int local_1cd8;
  int local_1cd4;
  long *local_1cd0;
  int local_1cc4;
  int local_1cc0;
  int local_1cbc;
  long *local_1cb8;
  int local_1cac;
  int local_1ca8;
  int local_1ca4;
  long *local_1ca0;
  int local_1c94;
  int local_1c90;
  int local_1c8c;
  long *local_1c88;
  int local_1c7c;
  int local_1c78;
  int local_1c74;
  long *local_1c70;
  int local_1c64;
  int local_1c60;
  int local_1c5c;
  long *local_1c58;
  int local_1c4c;
  int local_1c48;
  int local_1c44;
  long *local_1c40;
  int local_1c34;
  int local_1c30;
  int local_1c2c;
  long *local_1c28;
  int local_1c1c;
  int local_1c18;
  int local_1c14;
  long *local_1c10;
  int local_1c04;
  int local_1c00;
  int local_1bfc;
  long *local_1bf8;
  int local_1bec;
  int local_1be8;
  int local_1be4;
  long *local_1be0;
  int local_1bd4;
  int local_1bd0;
  int local_1bcc;
  long *local_1bc8;
  int local_1bbc;
  int local_1bb8;
  int local_1bb4;
  long *local_1bb0;
  int local_1ba4;
  int local_1ba0;
  int local_1b9c;
  long *local_1b98;
  int local_1b8c;
  int local_1b88;
  int local_1b84;
  long *local_1b80;
  int local_1b74;
  int local_1b70;
  int local_1b6c;
  long *local_1b68;
  int local_1b5c;
  int local_1b58;
  int local_1b54;
  long *local_1b50;
  int local_1b44;
  int local_1b40;
  int local_1b3c;
  long *local_1b38;
  int local_1b2c;
  int local_1b28;
  int local_1b24;
  long *local_1b20;
  int local_1b14;
  int local_1b10;
  int local_1b0c;
  long *local_1b08;
  int local_1afc;
  int local_1af8;
  int local_1af4;
  long *local_1af0;
  int local_1ae4;
  int local_1ae0;
  int local_1adc;
  long *local_1ad8;
  int local_1acc;
  int local_1ac8;
  int local_1ac4;
  long *local_1ac0;
  int local_1ab4;
  int local_1ab0;
  int local_1aac;
  long *local_1aa8;
  int local_1a9c;
  int local_1a98;
  int local_1a94;
  long *local_1a90;
  int local_1a84;
  int local_1a80;
  int local_1a7c;
  long *local_1a78;
  int local_1a6c;
  int local_1a68;
  int local_1a64;
  long *local_1a60;
  int local_1a54;
  int local_1a50;
  int local_1a4c;
  long *local_1a48;
  int local_1a3c;
  int local_1a38;
  int local_1a34;
  long *local_1a30;
  int local_1a24;
  int local_1a20;
  int local_1a1c;
  long *local_1a18;
  int local_1a0c;
  int local_1a08;
  int local_1a04;
  long *local_1a00;
  int local_19f4;
  int local_19f0;
  int local_19ec;
  long *local_19e8;
  int local_19dc;
  int local_19d8;
  int local_19d4;
  long *local_19d0;
  int local_19c4;
  int local_19c0;
  int local_19bc;
  long *local_19b8;
  int local_19ac;
  int local_19a8;
  int local_19a4;
  long *local_19a0;
  int local_1994;
  int local_1990;
  int local_198c;
  long *local_1988;
  int local_197c;
  int local_1978;
  int local_1974;
  long *local_1970;
  int local_1964;
  int local_1960;
  int local_195c;
  long *local_1958;
  int local_194c;
  int local_1948;
  int local_1944;
  long *local_1940;
  int local_1934;
  int local_1930;
  int local_192c;
  long *local_1928;
  int local_191c;
  int local_1918;
  int local_1914;
  long *local_1910;
  int local_1904;
  int local_1900;
  int local_18fc;
  long *local_18f8;
  int local_18ec;
  int local_18e8;
  int local_18e4;
  long *local_18e0;
  int local_18d4;
  int local_18d0;
  int local_18cc;
  long *local_18c8;
  int local_18bc;
  int local_18b8;
  int local_18b4;
  long *local_18b0;
  int local_18a4;
  int local_18a0;
  int local_189c;
  long *local_1898;
  int local_188c;
  int local_1888;
  int local_1884;
  long *local_1880;
  int local_1874;
  int local_1870;
  int local_186c;
  long *local_1868;
  int local_185c;
  int local_1858;
  int local_1854;
  long *local_1850;
  int local_1844;
  int local_1840;
  int local_183c;
  long *local_1838;
  int local_182c;
  int local_1828;
  int local_1824;
  long *local_1820;
  int local_1814;
  int local_1810;
  int local_180c;
  long *local_1808;
  int local_17fc;
  int local_17f8;
  int local_17f4;
  long *local_17f0;
  int local_17e4;
  int local_17e0;
  int local_17dc;
  long *local_17d8;
  int local_17cc;
  int local_17c8;
  int local_17c4;
  long *local_17c0;
  int local_17b4;
  int local_17b0;
  int local_17ac;
  long *local_17a8;
  int local_179c;
  int local_1798;
  int local_1794;
  long *local_1790;
  int local_1784;
  int local_1780;
  int local_177c;
  long *local_1778;
  int local_176c;
  int local_1768;
  int local_1764;
  long *local_1760;
  int local_1754;
  int local_1750;
  int local_174c;
  long *local_1748;
  int local_173c;
  int local_1738;
  int local_1734;
  long *local_1730;
  int local_1724;
  int local_1720;
  int local_171c;
  long *local_1718;
  int local_170c;
  int local_1708;
  int local_1704;
  long *local_1700;
  int local_16f4;
  int local_16f0;
  int local_16ec;
  long *local_16e8;
  int local_16dc;
  int local_16d8;
  int local_16d4;
  long *local_16d0;
  int local_16c4;
  int local_16c0;
  int local_16bc;
  long *local_16b8;
  int local_16ac;
  int local_16a8;
  int local_16a4;
  long *local_16a0;
  int local_1694;
  int local_1690;
  int local_168c;
  long *local_1688;
  int local_167c;
  int local_1678;
  int local_1674;
  long *local_1670;
  int local_1664;
  int local_1660;
  int local_165c;
  long *local_1658;
  int local_164c;
  int local_1648;
  int local_1644;
  long *local_1640;
  int local_1634;
  int local_1630;
  int local_162c;
  long *local_1628;
  int local_161c;
  int local_1618;
  int local_1614;
  long *local_1610;
  int local_1604;
  int local_1600;
  int local_15fc;
  long *local_15f8;
  int local_15ec;
  int local_15e8;
  int local_15e4;
  long *local_15e0;
  int local_15d4;
  int local_15d0;
  int local_15cc;
  long *local_15c8;
  int local_15bc;
  int local_15b8;
  int local_15b4;
  long *local_15b0;
  int local_15a4;
  int local_15a0;
  int local_159c;
  long *local_1598;
  int local_158c;
  int local_1588;
  int local_1584;
  long *local_1580;
  int local_1574;
  int local_1570;
  int local_156c;
  long *local_1568;
  int local_155c;
  int local_1558;
  int local_1554;
  long *local_1550;
  int local_1544;
  int local_1540;
  int local_153c;
  long *local_1538;
  int local_152c;
  int local_1528;
  int local_1524;
  long *local_1520;
  int local_1514;
  int local_1510;
  int local_150c;
  long *local_1508;
  int local_14fc;
  int local_14f8;
  int local_14f4;
  long *local_14f0;
  int local_14e4;
  int local_14e0;
  int local_14dc;
  long *local_14d8;
  int local_14cc;
  int local_14c8;
  int local_14c4;
  long *local_14c0;
  int local_14b4;
  int local_14b0;
  int local_14ac;
  long *local_14a8;
  int local_149c;
  int local_1498;
  int local_1494;
  long *local_1490;
  int local_1484;
  int local_1480;
  int local_147c;
  long *local_1478;
  int local_146c;
  int local_1468;
  int local_1464;
  long *local_1460;
  int local_1454;
  int local_1450;
  int local_144c;
  long *local_1448;
  int local_143c;
  int local_1438;
  int local_1434;
  long *local_1430;
  int local_1424;
  int local_1420;
  int local_141c;
  long *local_1418;
  int local_140c;
  int local_1408;
  int local_1404;
  long *local_1400;
  int local_13f4;
  int local_13f0;
  int local_13ec;
  long *local_13e8;
  int local_13dc;
  int local_13d8;
  int local_13d4;
  long *local_13d0;
  int local_13c4;
  int local_13c0;
  int local_13bc;
  long *local_13b8;
  int local_13ac;
  int local_13a8;
  int local_13a4;
  long *local_13a0;
  int local_1394;
  int local_1390;
  int local_138c;
  long *local_1388;
  int local_137c;
  int local_1378;
  int local_1374;
  long *local_1370;
  int local_1364;
  int local_1360;
  int local_135c;
  long *local_1358;
  int local_134c;
  int local_1348;
  int local_1344;
  long *local_1340;
  int local_1334;
  int local_1330;
  int local_132c;
  long *local_1328;
  int local_131c;
  int local_1318;
  int local_1314;
  long *local_1310;
  int local_1304;
  int local_1300;
  int local_12fc;
  long *local_12f8;
  int local_12ec;
  int local_12e8;
  int local_12e4;
  long *local_12e0;
  int local_12d4;
  int local_12d0;
  int local_12cc;
  long *local_12c8;
  int local_12bc;
  int local_12b8;
  int local_12b4;
  long *local_12b0;
  int local_12a4;
  int local_12a0;
  int local_129c;
  long *local_1298;
  int local_128c;
  int local_1288;
  int local_1284;
  long *local_1280;
  int local_1274;
  int local_1270;
  int local_126c;
  long *local_1268;
  int local_125c;
  int local_1258;
  int local_1254;
  long *local_1250;
  int local_1244;
  int local_1240;
  int local_123c;
  long *local_1238;
  int local_122c;
  int local_1228;
  int local_1224;
  long *local_1220;
  int local_1214;
  int local_1210;
  int local_120c;
  long *local_1208;
  int local_11fc;
  int local_11f8;
  int local_11f4;
  long *local_11f0;
  int local_11e4;
  int local_11e0;
  int local_11dc;
  long *local_11d8;
  int local_11cc;
  int local_11c8;
  int local_11c4;
  long *local_11c0;
  int local_11b4;
  int local_11b0;
  int local_11ac;
  long *local_11a8;
  int local_119c;
  int local_1198;
  int local_1194;
  long *local_1190;
  int local_1184;
  int local_1180;
  int local_117c;
  long *local_1178;
  int local_116c;
  int local_1168;
  int local_1164;
  long *local_1160;
  int local_1154;
  int local_1150;
  int local_114c;
  long *local_1148;
  int local_113c;
  int local_1138;
  int local_1134;
  long *local_1130;
  int local_1124;
  int local_1120;
  int local_111c;
  long *local_1118;
  int local_110c;
  int local_1108;
  int local_1104;
  long *local_1100;
  int local_10f4;
  int local_10f0;
  int local_10ec;
  long *local_10e8;
  int local_10dc;
  int local_10d8;
  int local_10d4;
  long *local_10d0;
  int local_10c4;
  int local_10c0;
  int local_10bc;
  long *local_10b8;
  int local_10ac;
  int local_10a8;
  int local_10a4;
  long *local_10a0;
  int local_1094;
  int local_1090;
  int local_108c;
  long *local_1088;
  int local_107c;
  int local_1078;
  int local_1074;
  long *local_1070;
  int local_1064;
  int local_1060;
  int local_105c;
  long *local_1058;
  int local_104c;
  int local_1048;
  int local_1044;
  long *local_1040;
  int local_1034;
  int local_1030;
  int local_102c;
  long *local_1028;
  int local_101c;
  int local_1018;
  int local_1014;
  long *local_1010;
  int local_1004;
  int local_1000;
  int local_ffc;
  long *local_ff8;
  int local_fec;
  int local_fe8;
  int local_fe4;
  long *local_fe0;
  int local_fd4;
  int local_fd0;
  int local_fcc;
  long *local_fc8;
  int local_fbc;
  int local_fb8;
  int local_fb4;
  long *local_fb0;
  int local_fa4;
  int local_fa0;
  int local_f9c;
  long *local_f98;
  int local_f8c;
  int local_f88;
  int local_f84;
  long *local_f80;
  int local_f74;
  int local_f70;
  int local_f6c;
  long *local_f68;
  int local_f5c;
  int local_f58;
  int local_f54;
  long *local_f50;
  int local_f44;
  int local_f40;
  int local_f3c;
  long *local_f38;
  int local_f2c;
  int local_f28;
  int local_f24;
  long *local_f20;
  int local_f14;
  int local_f10;
  int local_f0c;
  long *local_f08;
  int local_efc;
  int local_ef8;
  int local_ef4;
  long *local_ef0;
  int local_ee4;
  int local_ee0;
  int local_edc;
  long *local_ed8;
  int local_ecc;
  int local_ec8;
  int local_ec4;
  long *local_ec0;
  int local_eb4;
  int local_eb0;
  int local_eac;
  long *local_ea8;
  int local_e9c;
  int local_e98;
  int local_e94;
  long *local_e90;
  int local_e84;
  int local_e80;
  int local_e7c;
  long *local_e78;
  int local_e6c;
  int local_e68;
  int local_e64;
  long *local_e60;
  int local_e54;
  int local_e50;
  int local_e4c;
  long *local_e48;
  int local_e3c;
  int local_e38;
  int local_e34;
  long *local_e30;
  int local_e24;
  int local_e20;
  int local_e1c;
  long *local_e18;
  int local_e0c;
  int local_e08;
  int local_e04;
  long *local_e00;
  int local_df4;
  int local_df0;
  int local_dec;
  long *local_de8;
  int local_ddc;
  int local_dd8;
  int local_dd4;
  long *local_dd0;
  int local_dc4;
  int local_dc0;
  int local_dbc;
  long *local_db8;
  int local_dac;
  int local_da8;
  int local_da4;
  long *local_da0;
  int local_d94;
  int local_d90;
  int local_d8c;
  long *local_d88;
  int local_d7c;
  int local_d78;
  int local_d74;
  long *local_d70;
  int local_d64;
  int local_d60;
  int local_d5c;
  long *local_d58;
  undefined4 local_d4c;
  IntVect *local_d48;
  undefined4 local_d3c;
  IntVect *local_d38;
  undefined4 local_d2c;
  IntVect *local_d28;
  undefined4 local_d1c;
  IntVect *local_d18;
  undefined4 local_d0c;
  IntVect *local_d08;
  undefined4 local_cfc;
  IntVect *local_cf8;
  undefined4 local_cec;
  Box *local_ce8;
  undefined4 local_cdc;
  Box *local_cd8;
  undefined4 local_ccc;
  Box *local_cc8;
  undefined4 local_cbc;
  Box *local_cb8;
  undefined4 local_cac;
  Box *local_ca8;
  undefined4 local_c9c;
  Box *local_c98;
  undefined4 local_c8c;
  byte *local_c88;
  undefined4 local_c7c;
  byte *local_c78;
  undefined4 local_c6c;
  byte *local_c68;
  undefined4 local_c5c;
  byte *local_c58;
  undefined4 local_c4c;
  byte *local_c48;
  undefined4 local_c3c;
  byte *local_c38;
  undefined4 local_c2c;
  byte *local_c28;
  undefined4 local_c1c;
  byte *local_c18;
  undefined4 local_c0c;
  byte *local_c08;
  undefined4 local_bfc;
  byte *local_bf8;
  undefined4 local_bec;
  byte *local_be8;
  undefined4 local_bdc;
  byte *local_bd8;
  undefined4 local_bcc;
  byte *local_bc8;
  undefined4 local_bbc;
  byte *local_bb8;
  undefined4 local_bac;
  byte *local_ba8;
  undefined4 local_b9c;
  byte *local_b98;
  undefined4 local_b8c;
  byte *local_b88;
  undefined4 local_b7c;
  byte *local_b78;
  undefined4 local_b6c;
  byte *local_b68;
  undefined4 local_b5c;
  byte *local_b58;
  undefined4 local_b4c;
  byte *local_b48;
  undefined4 local_b3c;
  byte *local_b38;
  undefined4 local_b2c;
  byte *local_b28;
  undefined4 local_b1c;
  byte *local_b18;
  undefined4 local_b0c;
  byte *local_b08;
  undefined4 local_afc;
  byte *local_af8;
  undefined4 local_aec;
  byte *local_ae8;
  undefined4 local_adc;
  byte *local_ad8;
  undefined4 local_acc;
  byte *local_ac8;
  undefined4 local_abc;
  byte *local_ab8;
  undefined4 local_aac;
  byte *local_aa8;
  undefined4 local_a9c;
  byte *local_a98;
  undefined4 local_a8c;
  byte *local_a88;
  undefined4 local_a7c;
  byte *local_a78;
  undefined4 local_a6c;
  byte *local_a68;
  undefined4 local_a5c;
  byte *local_a58;
  undefined4 local_a4c;
  byte *local_a48;
  undefined4 local_a3c;
  byte *local_a38;
  undefined4 local_a2c;
  byte *local_a28;
  undefined4 local_a1c;
  byte *local_a18;
  undefined4 local_a0c;
  byte *local_a08;
  undefined4 local_9fc;
  byte *local_9f8;
  undefined4 local_9ec;
  byte *local_9e8;
  undefined4 local_9dc;
  byte *local_9d8;
  undefined4 local_9cc;
  byte *local_9c8;
  undefined4 local_9bc;
  byte *local_9b8;
  undefined4 local_9ac;
  byte *local_9a8;
  undefined4 local_99c;
  byte *local_998;
  undefined4 local_98c;
  byte *local_988;
  undefined4 local_97c;
  byte *local_978;
  undefined4 local_96c;
  byte *local_968;
  undefined4 local_95c;
  byte *local_958;
  undefined4 local_94c;
  byte *local_948;
  undefined4 local_93c;
  byte *local_938;
  undefined4 local_92c;
  byte *local_928;
  undefined4 local_91c;
  byte *local_918;
  undefined4 local_90c;
  byte *local_908;
  undefined4 local_8fc;
  byte *local_8f8;
  undefined4 local_8ec;
  byte *local_8e8;
  undefined4 local_8dc;
  byte *local_8d8;
  undefined4 local_8cc;
  byte *local_8c8;
  undefined4 local_8bc;
  byte *local_8b8;
  undefined4 local_8ac;
  byte *local_8a8;
  undefined4 local_89c;
  byte *local_898;
  undefined4 local_88c;
  byte *local_888;
  undefined4 local_87c;
  byte *local_878;
  undefined4 local_86c;
  byte *local_868;
  undefined4 local_85c;
  byte *local_858;
  undefined4 local_84c;
  byte *local_848;
  undefined4 local_83c;
  byte *local_838;
  undefined4 local_82c;
  byte *local_828;
  undefined4 local_81c;
  byte *local_818;
  undefined4 local_80c;
  byte *local_808;
  undefined4 local_7fc;
  byte *local_7f8;
  undefined4 local_7ec;
  byte *local_7e8;
  undefined4 local_7dc;
  byte *local_7d8;
  undefined4 local_7cc;
  byte *local_7c8;
  undefined4 local_7bc;
  byte *local_7b8;
  undefined4 local_7ac;
  byte *local_7a8;
  undefined4 local_79c;
  byte *local_798;
  undefined4 local_78c;
  byte *local_788;
  undefined4 local_77c;
  byte *local_778;
  undefined4 local_76c;
  byte *local_768;
  undefined4 local_75c;
  byte *local_758;
  undefined4 local_74c;
  byte *local_748;
  undefined4 local_73c;
  byte *local_738;
  undefined4 local_72c;
  byte *local_728;
  undefined4 local_71c;
  byte *local_718;
  undefined4 local_70c;
  byte *local_708;
  undefined4 local_6fc;
  byte *local_6f8;
  undefined4 local_6ec;
  byte *local_6e8;
  undefined4 local_6dc;
  byte *local_6d8;
  undefined4 local_6cc;
  byte *local_6c8;
  undefined4 local_6bc;
  byte *local_6b8;
  undefined4 local_6ac;
  byte *local_6a8;
  undefined4 local_69c;
  byte *local_698;
  undefined4 local_68c;
  byte *local_688;
  undefined4 local_67c;
  byte *local_678;
  undefined4 local_66c;
  byte *local_668;
  undefined4 local_65c;
  byte *local_658;
  undefined4 local_64c;
  byte *local_648;
  undefined4 local_63c;
  byte *local_638;
  undefined4 local_62c;
  byte *local_628;
  undefined4 local_61c;
  byte *local_618;
  undefined4 local_60c;
  byte *local_608;
  undefined4 local_5fc;
  byte *local_5f8;
  undefined4 local_5ec;
  byte *local_5e8;
  undefined4 local_5dc;
  byte *local_5d8;
  undefined4 local_5cc;
  byte *local_5c8;
  undefined4 local_5bc;
  byte *local_5b8;
  undefined4 local_5ac;
  byte *local_5a8;
  undefined4 local_59c;
  byte *local_598;
  undefined4 local_58c;
  byte *local_588;
  undefined4 local_57c;
  byte *local_578;
  undefined4 local_56c;
  byte *local_568;
  undefined4 local_55c;
  byte *local_558;
  undefined4 local_54c;
  byte *local_548;
  undefined4 local_53c;
  byte *local_538;
  undefined4 local_52c;
  byte *local_528;
  undefined4 local_51c;
  byte *local_518;
  undefined4 local_50c;
  byte *local_508;
  undefined4 local_4fc;
  byte *local_4f8;
  undefined4 local_4ec;
  byte *local_4e8;
  undefined4 local_4dc;
  byte *local_4d8;
  undefined4 local_4cc;
  byte *local_4c8;
  undefined4 local_4bc;
  byte *local_4b8;
  undefined4 local_4ac;
  byte *local_4a8;
  undefined4 local_49c;
  byte *local_498;
  undefined4 local_48c;
  byte *local_488;
  undefined4 local_47c;
  byte *local_478;
  undefined4 local_46c;
  byte *local_468;
  undefined4 local_45c;
  byte *local_458;
  undefined4 local_44c;
  byte *local_448;
  undefined4 local_43c;
  byte *local_438;
  undefined4 local_42c;
  byte *local_428;
  undefined4 local_41c;
  byte *local_418;
  undefined4 local_40c;
  byte *local_408;
  undefined4 local_3fc;
  byte *local_3f8;
  undefined4 local_3ec;
  byte *local_3e8;
  undefined4 local_3dc;
  byte *local_3d8;
  undefined4 local_3cc;
  byte *local_3c8;
  undefined4 local_3bc;
  byte *local_3b8;
  undefined4 local_3ac;
  byte *local_3a8;
  undefined4 local_39c;
  byte *local_398;
  undefined4 local_38c;
  byte *local_388;
  undefined4 local_37c;
  byte *local_378;
  undefined4 local_36c;
  byte *local_368;
  undefined4 local_35c;
  byte *local_358;
  undefined4 local_34c;
  byte *local_348;
  undefined4 local_33c;
  byte *local_338;
  undefined4 local_32c;
  byte *local_328;
  undefined4 local_31c;
  byte *local_318;
  undefined4 local_30c;
  byte *local_308;
  undefined4 local_2fc;
  byte *local_2f8;
  undefined4 local_2ec;
  byte *local_2e8;
  undefined4 local_2dc;
  byte *local_2d8;
  undefined4 local_2cc;
  byte *local_2c8;
  undefined4 local_2bc;
  byte *local_2b8;
  undefined4 local_2ac;
  byte *local_2a8;
  undefined4 local_29c;
  byte *local_298;
  undefined4 local_28c;
  byte *local_288;
  undefined4 local_27c;
  byte *local_278;
  undefined4 local_26c;
  byte *local_268;
  undefined4 local_25c;
  byte *local_258;
  undefined4 local_24c;
  byte *local_248;
  undefined4 local_23c;
  byte *local_238;
  undefined4 local_22c;
  byte *local_228;
  undefined4 local_21c;
  byte *local_218;
  undefined4 local_20c;
  byte *local_208;
  undefined4 local_1fc;
  byte *local_1f8;
  undefined4 local_1ec;
  byte *local_1e8;
  undefined4 local_1dc;
  byte *local_1d8;
  undefined4 local_1cc;
  byte *local_1c8;
  undefined4 local_1bc;
  byte *local_1b8;
  undefined4 local_1ac;
  byte *local_1a8;
  undefined4 local_19c;
  byte *local_198;
  undefined4 local_18c;
  byte *local_188;
  undefined4 local_17c;
  byte *local_178;
  undefined4 local_16c;
  byte *local_168;
  undefined4 local_15c;
  byte *local_158;
  undefined4 local_14c;
  byte *local_148;
  undefined4 local_13c;
  byte *local_138;
  undefined4 local_12c;
  byte *local_128;
  undefined4 local_11c;
  byte *local_118;
  undefined4 local_10c;
  byte *local_108;
  undefined4 local_fc;
  byte *local_f8;
  undefined4 local_ec;
  byte *local_e8;
  undefined4 local_dc;
  byte *local_d8;
  undefined4 local_cc;
  byte *local_c8;
  undefined4 local_bc;
  byte *local_b8;
  undefined4 local_ac;
  byte *local_a8;
  undefined4 local_9c;
  byte *local_98;
  undefined4 local_8c;
  byte *local_88;
  undefined4 local_7c;
  byte *local_78;
  undefined4 local_6c;
  byte *local_68;
  undefined4 local_5c;
  byte *local_58;
  undefined4 local_4c;
  byte *local_48;
  undefined4 local_3c;
  byte *local_38;
  int local_2c;
  byte *local_28;
  int local_1c;
  byte *local_18;
  undefined4 local_c;
  Box *local_8;
  
  local_208c.smallend.vect._0_8_ = *(undefined8 *)(in_RDX->smallend).vect;
  local_208c._8_8_ = *(undefined8 *)((in_RDX->smallend).vect + 2);
  local_208c.bigend.vect._4_8_ = *(undefined8 *)((in_RDX->bigend).vect + 1);
  local_208c.btype.itype = (in_RDX->btype).itype;
  local_2070 = in_R8;
  local_2068 = in_RCX;
  local_2060 = in_RDX;
  local_2058 = in_RSI;
  local_2050 = in_RDI;
  for (local_2090 = 0; local_2090 < 3; local_2090 = local_2090 + 1) {
    local_18 = local_2068;
    local_1c = local_2090;
    if ((local_2068[local_2090] & 1) == 0) {
      Box::growLo(&local_208c,local_2090,1);
    }
    local_28 = local_2070;
    local_2c = local_2090;
    if ((local_2070[local_2090] & 1) == 0) {
      Box::growHi(&local_208c,local_2090,1);
    }
  }
  bVar2 = Box::strictly_contains(&local_208c,local_2050);
  if (!bVar2) {
    bVar2 = Box::cellCentered(local_2060);
    local_2094 = (uint)!bVar2;
    local_2010 = local_2060;
    local_cc8 = local_2060;
    local_ccc = 0;
    local_2004 = (local_2060->smallend).vect[0];
    local_cd8 = local_2060;
    local_cdc = 1;
    iStack_2000 = (local_2060->smallend).vect[1];
    local_20b0 = *(undefined8 *)(local_2060->smallend).vect;
    local_ce8 = local_2060;
    local_cec = 2;
    local_20a8 = (local_2060->smallend).vect[2];
    local_1fc0 = local_2060;
    local_d28 = &local_2060->bigend;
    local_d2c = 0;
    local_1fb8 = local_d28->vect[0];
    local_d38 = &local_2060->bigend;
    local_d3c = 1;
    iStack_1fb4 = (local_2060->bigend).vect[1];
    local_20d0 = *(undefined8 *)local_d28->vect;
    local_d48 = &local_2060->bigend;
    local_d4c = 2;
    local_20c8 = (local_2060->bigend).vect[2];
    local_8 = local_2050;
    local_c = 1;
    local_20f8.smallend.vect._0_8_ = *(undefined8 *)(local_2050->smallend).vect;
    uVar1 = *(undefined8 *)((local_2050->smallend).vect + 2);
    local_20f8._20_8_ = *(undefined8 *)((local_2050->bigend).vect + 2);
    local_20f8.bigend.vect[1] = (int)((ulong)*(undefined8 *)(local_2050->bigend).vect >> 0x20);
    local_20f8.smallend.vect[2] = (int)uVar1;
    local_20f8.bigend.vect[0] = (int)((ulong)uVar1 >> 0x20);
    local_20c0 = local_20d0;
    local_20b8 = local_20c8;
    local_20a0 = local_20b0;
    local_2098 = local_20a8;
    local_2020 = local_20b0;
    local_2018 = local_20a8;
    local_1ffc = local_20a8;
    local_1fd0 = local_20d0;
    local_1fc8 = local_20c8;
    local_1fb0 = local_20c8;
    Box::grow(&local_20f8,1);
    local_c9c = 0;
    local_202c = local_20f8.smallend.vect[0];
    local_cac = 1;
    iStack_2028 = local_20f8.smallend.vect[1];
    local_2118[0] = local_20f8.smallend.vect[0];
    local_2118[1] = local_20f8.smallend.vect[1];
    local_cbc = 2;
    local_cf8 = &local_20f8.bigend;
    local_cfc = 0;
    local_1fdc = local_20f8.bigend.vect[0];
    local_d08 = &local_20f8.bigend;
    local_d0c = 1;
    iStack_1fd8 = local_20f8.bigend.vect[1];
    local_2138 = CONCAT44(local_20f8.bigend.vect[1],local_20f8.bigend.vect[0]);
    local_d18 = &local_20f8.bigend;
    local_d1c = 2;
    local_2130 = local_20f8.bigend.vect[2];
    local_213c = local_20f8.smallend.vect[2];
    local_2124 = local_2138;
    local_211c = local_2130;
    local_2110 = local_213c;
    _local_2108 = local_2118;
    local_2100 = local_213c;
    local_20d8 = &local_20f8;
    local_2048 = local_2118;
    local_2040 = local_213c;
    local_2038 = &local_20f8;
    local_2024 = local_213c;
    local_1ff8 = local_2138;
    local_1ff0 = local_2130;
    local_1fe8 = &local_20f8;
    local_1fd4 = local_2130;
    local_cb8 = &local_20f8;
    local_ca8 = &local_20f8;
    local_c98 = &local_20f8;
    for (; local_213c <= local_211c; local_213c = local_213c + 1) {
      for (local_2140 = iStack_2104; local_2140 <= local_2124._4_4_; local_2140 = local_2140 + 1) {
        for (local_2144 = local_2108; local_2144 <= (int)local_2124; local_2144 = local_2144 + 1) {
          IntVect::IntVect(&local_2150,local_2144,local_2140,local_213c);
          bVar2 = Box::contains(&local_208c,&local_2150);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            if (((local_2144 == (int)local_20a0 + -1) && (local_2140 == local_20a0._4_4_ + -1)) &&
               (local_213c == local_2098 + -1)) {
              local_38 = local_2068;
              local_3c = 0;
              if ((*local_2068 & 1) == 0) {
                local_48 = local_2068;
                local_4c = 1;
                if ((local_2068[1] & 1) == 0) {
                  local_58 = local_2068;
                  local_5c = 2;
                  if ((local_2068[2] & 1) == 0) goto LAB_01355516;
                }
              }
              local_68 = local_2068;
              local_6c = 0;
              if ((*local_2068 & 1) != 0) {
                local_78 = local_2068;
                local_7c = 1;
                if ((local_2068[1] & 1) != 0) {
                  local_88 = local_2068;
                  local_8c = 2;
                  if ((local_2068[2] & 1) != 0) {
                    local_d5c = local_2144 + 1 + local_2094;
                    local_d60 = local_2140 + 1 + local_2094;
                    local_d64 = local_213c + 1 + local_2094;
                    local_d58 = local_2058;
                    local_d70 = local_2058;
                    local_d74 = local_2144;
                    local_d78 = local_2140;
                    local_d7c = local_213c;
                    *(undefined8 *)
                     (*local_2058 +
                     ((long)(local_2144 - (int)local_2058[4]) +
                      (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                     (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                         *(undefined8 *)
                          (*local_2058 +
                          ((long)(local_d5c - (int)local_2058[4]) +
                           (long)(local_d60 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                          (long)(local_d64 - (int)local_2058[5]) * local_2058[2]) * 8);
                    goto LAB_0135dc21;
                  }
                }
              }
              local_98 = local_2068;
              local_9c = 0;
              if ((*local_2068 & 1) != 0) {
                local_a8 = local_2068;
                local_ac = 1;
                if ((local_2068[1] & 1) != 0) {
                  local_d8c = local_2144 + 1 + local_2094;
                  local_d90 = local_2140 + 1 + local_2094;
                  local_d88 = local_2058;
                  local_d94 = local_213c;
                  local_da0 = local_2058;
                  local_da4 = local_2144;
                  local_da8 = local_2140;
                  local_dac = local_213c;
                  *(undefined8 *)
                   (*local_2058 +
                   ((long)(local_2144 - (int)local_2058[4]) +
                    (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                   (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                       *(undefined8 *)
                        (*local_2058 +
                        ((long)(local_d8c - (int)local_2058[4]) +
                         (long)(local_d90 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                        (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8);
                  goto LAB_0135dc21;
                }
              }
              local_b8 = local_2068;
              local_bc = 0;
              if ((*local_2068 & 1) != 0) {
                local_c8 = local_2068;
                local_cc = 2;
                if ((local_2068[2] & 1) != 0) {
                  local_dbc = local_2144 + 1 + local_2094;
                  local_dc4 = local_213c + 1 + local_2094;
                  local_db8 = local_2058;
                  local_dc0 = local_2140;
                  local_dd0 = local_2058;
                  local_dd4 = local_2144;
                  local_dd8 = local_2140;
                  local_ddc = local_213c;
                  *(undefined8 *)
                   (*local_2058 +
                   ((long)(local_2144 - (int)local_2058[4]) +
                    (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                   (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                       *(undefined8 *)
                        (*local_2058 +
                        ((long)(local_dbc - (int)local_2058[4]) +
                         (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                        (long)(local_dc4 - (int)local_2058[5]) * local_2058[2]) * 8);
                  goto LAB_0135dc21;
                }
              }
              local_d8 = local_2068;
              local_dc = 1;
              if ((local_2068[1] & 1) != 0) {
                local_e8 = local_2068;
                local_ec = 2;
                if ((local_2068[2] & 1) != 0) {
                  local_df0 = local_2140 + 1 + local_2094;
                  local_df4 = local_213c + 1 + local_2094;
                  local_de8 = local_2058;
                  local_dec = local_2144;
                  local_e00 = local_2058;
                  local_e04 = local_2144;
                  local_e08 = local_2140;
                  local_e0c = local_213c;
                  *(undefined8 *)
                   (*local_2058 +
                   ((long)(local_2144 - (int)local_2058[4]) +
                    (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                   (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                       *(undefined8 *)
                        (*local_2058 +
                        ((long)(local_2144 - (int)local_2058[4]) +
                         (long)(local_df0 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                        (long)(local_df4 - (int)local_2058[5]) * local_2058[2]) * 8);
                  goto LAB_0135dc21;
                }
              }
              local_f8 = local_2068;
              local_fc = 0;
              if ((*local_2068 & 1) == 0) {
                local_108 = local_2068;
                local_10c = 1;
                if ((local_2068[1] & 1) == 0) {
                  local_118 = local_2068;
                  local_11c = 2;
                  if ((local_2068[2] & 1) != 0) {
                    local_e84 = local_213c + 1 + local_2094;
                    local_e78 = local_2058;
                    local_e7c = local_2144;
                    local_e80 = local_2140;
                    local_e90 = local_2058;
                    local_e94 = local_2144;
                    local_e98 = local_2140;
                    local_e9c = local_213c;
                    *(undefined8 *)
                     (*local_2058 +
                     ((long)(local_2144 - (int)local_2058[4]) +
                      (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                     (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                         *(undefined8 *)
                          (*local_2058 +
                          ((long)(local_2144 - (int)local_2058[4]) +
                           (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                          (long)(local_e84 - (int)local_2058[5]) * local_2058[2]) * 8);
                  }
                }
                else {
                  local_e50 = local_2140 + 1 + local_2094;
                  local_e48 = local_2058;
                  local_e4c = local_2144;
                  local_e54 = local_213c;
                  local_e60 = local_2058;
                  local_e64 = local_2144;
                  local_e68 = local_2140;
                  local_e6c = local_213c;
                  *(undefined8 *)
                   (*local_2058 +
                   ((long)(local_2144 - (int)local_2058[4]) +
                    (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                   (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                       *(undefined8 *)
                        (*local_2058 +
                        ((long)(local_2144 - (int)local_2058[4]) +
                         (long)(local_e50 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                        (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8);
                }
              }
              else {
                local_e1c = local_2144 + 1 + local_2094;
                local_e18 = local_2058;
                local_e20 = local_2140;
                local_e24 = local_213c;
                local_e30 = local_2058;
                local_e34 = local_2144;
                local_e38 = local_2140;
                local_e3c = local_213c;
                *(undefined8 *)
                 (*local_2058 +
                 ((long)(local_2144 - (int)local_2058[4]) +
                  (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                 (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                     *(undefined8 *)
                      (*local_2058 +
                      ((long)(local_e1c - (int)local_2058[4]) +
                       (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                      (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8);
              }
            }
            else {
LAB_01355516:
              if (((local_2144 == (int)local_20c0 + 1) && (local_2140 == local_20a0._4_4_ + -1)) &&
                 (local_213c == local_2098 + -1)) {
                local_128 = local_2070;
                local_12c = 0;
                if ((*local_2070 & 1) == 0) {
                  local_138 = local_2068;
                  local_13c = 1;
                  if ((local_2068[1] & 1) == 0) {
                    local_148 = local_2068;
                    local_14c = 2;
                    if ((local_2068[2] & 1) == 0) goto LAB_01355fa2;
                  }
                }
                local_158 = local_2070;
                local_15c = 0;
                if ((*local_2070 & 1) != 0) {
                  local_168 = local_2068;
                  local_16c = 1;
                  if ((local_2068[1] & 1) != 0) {
                    local_178 = local_2068;
                    local_17c = 2;
                    if ((local_2068[2] & 1) != 0) {
                      local_eac = (local_2144 + -1) - local_2094;
                      local_eb0 = local_2140 + 1 + local_2094;
                      local_eb4 = local_213c + 1 + local_2094;
                      local_ea8 = local_2058;
                      local_ec0 = local_2058;
                      local_ec4 = local_2144;
                      local_ec8 = local_2140;
                      local_ecc = local_213c;
                      *(undefined8 *)
                       (*local_2058 +
                       ((long)(local_2144 - (int)local_2058[4]) +
                        (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                       (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                           *(undefined8 *)
                            (*local_2058 +
                            ((long)(local_eac - (int)local_2058[4]) +
                             (long)(local_eb0 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                            (long)(local_eb4 - (int)local_2058[5]) * local_2058[2]) * 8);
                      goto LAB_0135dc21;
                    }
                  }
                }
                local_188 = local_2070;
                local_18c = 0;
                if ((*local_2070 & 1) != 0) {
                  local_198 = local_2068;
                  local_19c = 1;
                  if ((local_2068[1] & 1) != 0) {
                    local_edc = (local_2144 + -1) - local_2094;
                    local_ee0 = local_2140 + 1 + local_2094;
                    local_ed8 = local_2058;
                    local_ee4 = local_213c;
                    local_ef0 = local_2058;
                    local_ef4 = local_2144;
                    local_ef8 = local_2140;
                    local_efc = local_213c;
                    *(undefined8 *)
                     (*local_2058 +
                     ((long)(local_2144 - (int)local_2058[4]) +
                      (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                     (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                         *(undefined8 *)
                          (*local_2058 +
                          ((long)(local_edc - (int)local_2058[4]) +
                           (long)(local_ee0 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                          (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8);
                    goto LAB_0135dc21;
                  }
                }
                local_1a8 = local_2070;
                local_1ac = 0;
                if ((*local_2070 & 1) != 0) {
                  local_1b8 = local_2068;
                  local_1bc = 2;
                  if ((local_2068[2] & 1) != 0) {
                    local_f0c = (local_2144 + -1) - local_2094;
                    local_f14 = local_213c + 1 + local_2094;
                    local_f08 = local_2058;
                    local_f10 = local_2140;
                    local_f20 = local_2058;
                    local_f24 = local_2144;
                    local_f28 = local_2140;
                    local_f2c = local_213c;
                    *(undefined8 *)
                     (*local_2058 +
                     ((long)(local_2144 - (int)local_2058[4]) +
                      (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                     (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                         *(undefined8 *)
                          (*local_2058 +
                          ((long)(local_f0c - (int)local_2058[4]) +
                           (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                          (long)(local_f14 - (int)local_2058[5]) * local_2058[2]) * 8);
                    goto LAB_0135dc21;
                  }
                }
                local_1c8 = local_2068;
                local_1cc = 1;
                if ((local_2068[1] & 1) != 0) {
                  local_1d8 = local_2068;
                  local_1dc = 2;
                  if ((local_2068[2] & 1) != 0) {
                    local_f40 = local_2140 + 1 + local_2094;
                    local_f44 = local_213c + 1 + local_2094;
                    local_f38 = local_2058;
                    local_f3c = local_2144;
                    local_f50 = local_2058;
                    local_f54 = local_2144;
                    local_f58 = local_2140;
                    local_f5c = local_213c;
                    *(undefined8 *)
                     (*local_2058 +
                     ((long)(local_2144 - (int)local_2058[4]) +
                      (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                     (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                         *(undefined8 *)
                          (*local_2058 +
                          ((long)(local_2144 - (int)local_2058[4]) +
                           (long)(local_f40 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                          (long)(local_f44 - (int)local_2058[5]) * local_2058[2]) * 8);
                    goto LAB_0135dc21;
                  }
                }
                local_1e8 = local_2070;
                local_1ec = 0;
                if ((*local_2070 & 1) == 0) {
                  local_1f8 = local_2068;
                  local_1fc = 1;
                  if ((local_2068[1] & 1) == 0) {
                    local_208 = local_2068;
                    local_20c = 2;
                    if ((local_2068[2] & 1) != 0) {
                      local_fd4 = local_213c + 1 + local_2094;
                      local_fc8 = local_2058;
                      local_fcc = local_2144;
                      local_fd0 = local_2140;
                      local_fe0 = local_2058;
                      local_fe4 = local_2144;
                      local_fe8 = local_2140;
                      local_fec = local_213c;
                      *(undefined8 *)
                       (*local_2058 +
                       ((long)(local_2144 - (int)local_2058[4]) +
                        (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                       (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                           *(undefined8 *)
                            (*local_2058 +
                            ((long)(local_2144 - (int)local_2058[4]) +
                             (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                            + (long)(local_fd4 - (int)local_2058[5]) * local_2058[2]) * 8);
                    }
                  }
                  else {
                    local_fa0 = local_2140 + 1 + local_2094;
                    local_f98 = local_2058;
                    local_f9c = local_2144;
                    local_fa4 = local_213c;
                    local_fb0 = local_2058;
                    local_fb4 = local_2144;
                    local_fb8 = local_2140;
                    local_fbc = local_213c;
                    *(undefined8 *)
                     (*local_2058 +
                     ((long)(local_2144 - (int)local_2058[4]) +
                      (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                     (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                         *(undefined8 *)
                          (*local_2058 +
                          ((long)(local_2144 - (int)local_2058[4]) +
                           (long)(local_fa0 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                          (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8);
                  }
                }
                else {
                  local_f6c = (local_2144 + -1) - local_2094;
                  local_f68 = local_2058;
                  local_f70 = local_2140;
                  local_f74 = local_213c;
                  local_f80 = local_2058;
                  local_f84 = local_2144;
                  local_f88 = local_2140;
                  local_f8c = local_213c;
                  *(undefined8 *)
                   (*local_2058 +
                   ((long)(local_2144 - (int)local_2058[4]) +
                    (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                   (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                       *(undefined8 *)
                        (*local_2058 +
                        ((long)(local_f6c - (int)local_2058[4]) +
                         (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                        (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8);
                }
              }
              else {
LAB_01355fa2:
                if (((local_2144 == (int)local_20a0 + -1) && (local_2140 == local_20c0._4_4_ + 1))
                   && (local_213c == local_2098 + -1)) {
                  local_218 = local_2068;
                  local_21c = 0;
                  if ((*local_2068 & 1) == 0) {
                    local_228 = local_2070;
                    local_22c = 1;
                    if ((local_2070[1] & 1) == 0) {
                      local_238 = local_2068;
                      local_23c = 2;
                      if ((local_2068[2] & 1) == 0) goto LAB_01356a2e;
                    }
                  }
                  local_248 = local_2068;
                  local_24c = 0;
                  if ((*local_2068 & 1) != 0) {
                    local_258 = local_2070;
                    local_25c = 1;
                    if ((local_2070[1] & 1) != 0) {
                      local_268 = local_2068;
                      local_26c = 2;
                      if ((local_2068[2] & 1) != 0) {
                        local_ffc = local_2144 + 1 + local_2094;
                        local_1000 = (local_2140 + -1) - local_2094;
                        local_1004 = local_213c + 1 + local_2094;
                        local_ff8 = local_2058;
                        local_1010 = local_2058;
                        local_1014 = local_2144;
                        local_1018 = local_2140;
                        local_101c = local_213c;
                        *(undefined8 *)
                         (*local_2058 +
                         ((long)(local_2144 - (int)local_2058[4]) +
                          (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                         (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                             *(undefined8 *)
                              (*local_2058 +
                              ((long)(local_ffc - (int)local_2058[4]) +
                               (long)(local_1000 - *(int *)((long)local_2058 + 0x24)) *
                               local_2058[1] +
                              (long)(local_1004 - (int)local_2058[5]) * local_2058[2]) * 8);
                        goto LAB_0135dc21;
                      }
                    }
                  }
                  local_278 = local_2068;
                  local_27c = 0;
                  if ((*local_2068 & 1) != 0) {
                    local_288 = local_2070;
                    local_28c = 1;
                    if ((local_2070[1] & 1) != 0) {
                      local_102c = local_2144 + 1 + local_2094;
                      local_1030 = (local_2140 + -1) - local_2094;
                      local_1028 = local_2058;
                      local_1034 = local_213c;
                      local_1040 = local_2058;
                      local_1044 = local_2144;
                      local_1048 = local_2140;
                      local_104c = local_213c;
                      *(undefined8 *)
                       (*local_2058 +
                       ((long)(local_2144 - (int)local_2058[4]) +
                        (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                       (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                           *(undefined8 *)
                            (*local_2058 +
                            ((long)(local_102c - (int)local_2058[4]) +
                             (long)(local_1030 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                            + (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8);
                      goto LAB_0135dc21;
                    }
                  }
                  local_298 = local_2068;
                  local_29c = 0;
                  if ((*local_2068 & 1) != 0) {
                    local_2a8 = local_2068;
                    local_2ac = 2;
                    if ((local_2068[2] & 1) != 0) {
                      local_105c = local_2144 + 1 + local_2094;
                      local_1064 = local_213c + 1 + local_2094;
                      local_1058 = local_2058;
                      local_1060 = local_2140;
                      local_1070 = local_2058;
                      local_1074 = local_2144;
                      local_1078 = local_2140;
                      local_107c = local_213c;
                      *(undefined8 *)
                       (*local_2058 +
                       ((long)(local_2144 - (int)local_2058[4]) +
                        (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                       (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                           *(undefined8 *)
                            (*local_2058 +
                            ((long)(local_105c - (int)local_2058[4]) +
                             (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                            + (long)(local_1064 - (int)local_2058[5]) * local_2058[2]) * 8);
                      goto LAB_0135dc21;
                    }
                  }
                  local_2b8 = local_2070;
                  local_2bc = 1;
                  if ((local_2070[1] & 1) != 0) {
                    local_2c8 = local_2068;
                    local_2cc = 2;
                    if ((local_2068[2] & 1) != 0) {
                      local_1090 = (local_2140 + -1) - local_2094;
                      local_1094 = local_213c + 1 + local_2094;
                      local_1088 = local_2058;
                      local_108c = local_2144;
                      local_10a0 = local_2058;
                      local_10a4 = local_2144;
                      local_10a8 = local_2140;
                      local_10ac = local_213c;
                      *(undefined8 *)
                       (*local_2058 +
                       ((long)(local_2144 - (int)local_2058[4]) +
                        (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                       (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                           *(undefined8 *)
                            (*local_2058 +
                            ((long)(local_2144 - (int)local_2058[4]) +
                             (long)(local_1090 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                            + (long)(local_1094 - (int)local_2058[5]) * local_2058[2]) * 8);
                      goto LAB_0135dc21;
                    }
                  }
                  local_2d8 = local_2068;
                  local_2dc = 0;
                  if ((*local_2068 & 1) == 0) {
                    local_2e8 = local_2070;
                    local_2ec = 1;
                    if ((local_2070[1] & 1) == 0) {
                      local_2f8 = local_2068;
                      local_2fc = 2;
                      if ((local_2068[2] & 1) != 0) {
                        local_1124 = local_213c + 1 + local_2094;
                        local_1118 = local_2058;
                        local_111c = local_2144;
                        local_1120 = local_2140;
                        local_1130 = local_2058;
                        local_1134 = local_2144;
                        local_1138 = local_2140;
                        local_113c = local_213c;
                        *(undefined8 *)
                         (*local_2058 +
                         ((long)(local_2144 - (int)local_2058[4]) +
                          (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                         (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                             *(undefined8 *)
                              (*local_2058 +
                              ((long)(local_2144 - (int)local_2058[4]) +
                               (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                               local_2058[1] +
                              (long)(local_1124 - (int)local_2058[5]) * local_2058[2]) * 8);
                      }
                    }
                    else {
                      local_10f0 = (local_2140 + -1) - local_2094;
                      local_10e8 = local_2058;
                      local_10ec = local_2144;
                      local_10f4 = local_213c;
                      local_1100 = local_2058;
                      local_1104 = local_2144;
                      local_1108 = local_2140;
                      local_110c = local_213c;
                      *(undefined8 *)
                       (*local_2058 +
                       ((long)(local_2144 - (int)local_2058[4]) +
                        (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                       (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                           *(undefined8 *)
                            (*local_2058 +
                            ((long)(local_2144 - (int)local_2058[4]) +
                             (long)(local_10f0 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                            + (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8);
                    }
                  }
                  else {
                    local_10bc = local_2144 + 1 + local_2094;
                    local_10b8 = local_2058;
                    local_10c0 = local_2140;
                    local_10c4 = local_213c;
                    local_10d0 = local_2058;
                    local_10d4 = local_2144;
                    local_10d8 = local_2140;
                    local_10dc = local_213c;
                    *(undefined8 *)
                     (*local_2058 +
                     ((long)(local_2144 - (int)local_2058[4]) +
                      (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                     (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                         *(undefined8 *)
                          (*local_2058 +
                          ((long)(local_10bc - (int)local_2058[4]) +
                           (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                          (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8);
                  }
                }
                else {
LAB_01356a2e:
                  if (((local_2144 == (int)local_20c0 + 1) && (local_2140 == local_20c0._4_4_ + 1))
                     && (local_213c == local_2098 + -1)) {
                    local_308 = local_2070;
                    local_30c = 0;
                    if ((*local_2070 & 1) == 0) {
                      local_318 = local_2070;
                      local_31c = 1;
                      if ((local_2070[1] & 1) == 0) {
                        local_328 = local_2068;
                        local_32c = 2;
                        if ((local_2068[2] & 1) == 0) goto LAB_013574ba;
                      }
                    }
                    local_338 = local_2070;
                    local_33c = 0;
                    if ((*local_2070 & 1) != 0) {
                      local_348 = local_2070;
                      local_34c = 1;
                      if ((local_2070[1] & 1) != 0) {
                        local_358 = local_2068;
                        local_35c = 2;
                        if ((local_2068[2] & 1) != 0) {
                          local_114c = (local_2144 + -1) - local_2094;
                          local_1150 = (local_2140 + -1) - local_2094;
                          local_1154 = local_213c + 1 + local_2094;
                          local_1148 = local_2058;
                          local_1160 = local_2058;
                          local_1164 = local_2144;
                          local_1168 = local_2140;
                          local_116c = local_213c;
                          *(undefined8 *)
                           (*local_2058 +
                           ((long)(local_2144 - (int)local_2058[4]) +
                            (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                           (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                               *(undefined8 *)
                                (*local_2058 +
                                ((long)(local_114c - (int)local_2058[4]) +
                                 (long)(local_1150 - *(int *)((long)local_2058 + 0x24)) *
                                 local_2058[1] +
                                (long)(local_1154 - (int)local_2058[5]) * local_2058[2]) * 8);
                          goto LAB_0135dc21;
                        }
                      }
                    }
                    local_368 = local_2070;
                    local_36c = 0;
                    if ((*local_2070 & 1) != 0) {
                      local_378 = local_2070;
                      local_37c = 1;
                      if ((local_2070[1] & 1) != 0) {
                        local_117c = (local_2144 + -1) - local_2094;
                        local_1180 = (local_2140 + -1) - local_2094;
                        local_1178 = local_2058;
                        local_1184 = local_213c;
                        local_1190 = local_2058;
                        local_1194 = local_2144;
                        local_1198 = local_2140;
                        local_119c = local_213c;
                        *(undefined8 *)
                         (*local_2058 +
                         ((long)(local_2144 - (int)local_2058[4]) +
                          (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                         (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                             *(undefined8 *)
                              (*local_2058 +
                              ((long)(local_117c - (int)local_2058[4]) +
                               (long)(local_1180 - *(int *)((long)local_2058 + 0x24)) *
                               local_2058[1] +
                              (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8);
                        goto LAB_0135dc21;
                      }
                    }
                    local_388 = local_2070;
                    local_38c = 0;
                    if ((*local_2070 & 1) != 0) {
                      local_398 = local_2068;
                      local_39c = 2;
                      if ((local_2068[2] & 1) != 0) {
                        local_11ac = (local_2144 + -1) - local_2094;
                        local_11b4 = local_213c + 1 + local_2094;
                        local_11a8 = local_2058;
                        local_11b0 = local_2140;
                        local_11c0 = local_2058;
                        local_11c4 = local_2144;
                        local_11c8 = local_2140;
                        local_11cc = local_213c;
                        *(undefined8 *)
                         (*local_2058 +
                         ((long)(local_2144 - (int)local_2058[4]) +
                          (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                         (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                             *(undefined8 *)
                              (*local_2058 +
                              ((long)(local_11ac - (int)local_2058[4]) +
                               (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                               local_2058[1] +
                              (long)(local_11b4 - (int)local_2058[5]) * local_2058[2]) * 8);
                        goto LAB_0135dc21;
                      }
                    }
                    local_3a8 = local_2070;
                    local_3ac = 1;
                    if ((local_2070[1] & 1) != 0) {
                      local_3b8 = local_2068;
                      local_3bc = 2;
                      if ((local_2068[2] & 1) != 0) {
                        local_11e0 = (local_2140 + -1) - local_2094;
                        local_11e4 = local_213c + 1 + local_2094;
                        local_11d8 = local_2058;
                        local_11dc = local_2144;
                        local_11f0 = local_2058;
                        local_11f4 = local_2144;
                        local_11f8 = local_2140;
                        local_11fc = local_213c;
                        *(undefined8 *)
                         (*local_2058 +
                         ((long)(local_2144 - (int)local_2058[4]) +
                          (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                         (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                             *(undefined8 *)
                              (*local_2058 +
                              ((long)(local_2144 - (int)local_2058[4]) +
                               (long)(local_11e0 - *(int *)((long)local_2058 + 0x24)) *
                               local_2058[1] +
                              (long)(local_11e4 - (int)local_2058[5]) * local_2058[2]) * 8);
                        goto LAB_0135dc21;
                      }
                    }
                    local_3c8 = local_2070;
                    local_3cc = 0;
                    if ((*local_2070 & 1) == 0) {
                      local_3d8 = local_2070;
                      local_3dc = 1;
                      if ((local_2070[1] & 1) == 0) {
                        local_3e8 = local_2068;
                        local_3ec = 2;
                        if ((local_2068[2] & 1) != 0) {
                          local_1274 = local_213c + 1 + local_2094;
                          local_1268 = local_2058;
                          local_126c = local_2144;
                          local_1270 = local_2140;
                          local_1280 = local_2058;
                          local_1284 = local_2144;
                          local_1288 = local_2140;
                          local_128c = local_213c;
                          *(undefined8 *)
                           (*local_2058 +
                           ((long)(local_2144 - (int)local_2058[4]) +
                            (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                           (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                               *(undefined8 *)
                                (*local_2058 +
                                ((long)(local_2144 - (int)local_2058[4]) +
                                 (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                 local_2058[1] +
                                (long)(local_1274 - (int)local_2058[5]) * local_2058[2]) * 8);
                        }
                      }
                      else {
                        local_1240 = (local_2140 + -1) - local_2094;
                        local_1238 = local_2058;
                        local_123c = local_2144;
                        local_1244 = local_213c;
                        local_1250 = local_2058;
                        local_1254 = local_2144;
                        local_1258 = local_2140;
                        local_125c = local_213c;
                        *(undefined8 *)
                         (*local_2058 +
                         ((long)(local_2144 - (int)local_2058[4]) +
                          (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                         (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                             *(undefined8 *)
                              (*local_2058 +
                              ((long)(local_2144 - (int)local_2058[4]) +
                               (long)(local_1240 - *(int *)((long)local_2058 + 0x24)) *
                               local_2058[1] +
                              (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8);
                      }
                    }
                    else {
                      local_120c = (local_2144 + -1) - local_2094;
                      local_1208 = local_2058;
                      local_1210 = local_2140;
                      local_1214 = local_213c;
                      local_1220 = local_2058;
                      local_1224 = local_2144;
                      local_1228 = local_2140;
                      local_122c = local_213c;
                      *(undefined8 *)
                       (*local_2058 +
                       ((long)(local_2144 - (int)local_2058[4]) +
                        (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                       (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                           *(undefined8 *)
                            (*local_2058 +
                            ((long)(local_120c - (int)local_2058[4]) +
                             (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                            + (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8);
                    }
                  }
                  else {
LAB_013574ba:
                    if (((local_2144 == (int)local_20a0 + -1) &&
                        (local_2140 == local_20a0._4_4_ + -1)) && (local_213c == local_20b8 + 1)) {
                      local_3f8 = local_2068;
                      local_3fc = 0;
                      if ((*local_2068 & 1) == 0) {
                        local_408 = local_2068;
                        local_40c = 1;
                        if ((local_2068[1] & 1) == 0) {
                          local_418 = local_2070;
                          local_41c = 2;
                          if ((local_2070[2] & 1) == 0) goto LAB_01357f46;
                        }
                      }
                      local_428 = local_2068;
                      local_42c = 0;
                      if ((*local_2068 & 1) != 0) {
                        local_438 = local_2068;
                        local_43c = 1;
                        if ((local_2068[1] & 1) != 0) {
                          local_448 = local_2070;
                          local_44c = 2;
                          if ((local_2070[2] & 1) != 0) {
                            local_129c = local_2144 + 1 + local_2094;
                            local_12a0 = local_2140 + 1 + local_2094;
                            local_12a4 = (local_213c + -1) - local_2094;
                            local_1298 = local_2058;
                            local_12b0 = local_2058;
                            local_12b4 = local_2144;
                            local_12b8 = local_2140;
                            local_12bc = local_213c;
                            *(undefined8 *)
                             (*local_2058 +
                             ((long)(local_2144 - (int)local_2058[4]) +
                              (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                             + (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                 *(undefined8 *)
                                  (*local_2058 +
                                  ((long)(local_129c - (int)local_2058[4]) +
                                   (long)(local_12a0 - *(int *)((long)local_2058 + 0x24)) *
                                   local_2058[1] +
                                  (long)(local_12a4 - (int)local_2058[5]) * local_2058[2]) * 8);
                            goto LAB_0135dc21;
                          }
                        }
                      }
                      local_458 = local_2068;
                      local_45c = 0;
                      if ((*local_2068 & 1) != 0) {
                        local_468 = local_2068;
                        local_46c = 1;
                        if ((local_2068[1] & 1) != 0) {
                          local_12cc = local_2144 + 1 + local_2094;
                          local_12d0 = local_2140 + 1 + local_2094;
                          local_12c8 = local_2058;
                          local_12d4 = local_213c;
                          local_12e0 = local_2058;
                          local_12e4 = local_2144;
                          local_12e8 = local_2140;
                          local_12ec = local_213c;
                          *(undefined8 *)
                           (*local_2058 +
                           ((long)(local_2144 - (int)local_2058[4]) +
                            (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                           (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                               *(undefined8 *)
                                (*local_2058 +
                                ((long)(local_12cc - (int)local_2058[4]) +
                                 (long)(local_12d0 - *(int *)((long)local_2058 + 0x24)) *
                                 local_2058[1] +
                                (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8);
                          goto LAB_0135dc21;
                        }
                      }
                      local_478 = local_2068;
                      local_47c = 0;
                      if ((*local_2068 & 1) != 0) {
                        local_488 = local_2070;
                        local_48c = 2;
                        if ((local_2070[2] & 1) != 0) {
                          local_12fc = local_2144 + 1 + local_2094;
                          local_1304 = (local_213c + -1) - local_2094;
                          local_12f8 = local_2058;
                          local_1300 = local_2140;
                          local_1310 = local_2058;
                          local_1314 = local_2144;
                          local_1318 = local_2140;
                          local_131c = local_213c;
                          *(undefined8 *)
                           (*local_2058 +
                           ((long)(local_2144 - (int)local_2058[4]) +
                            (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                           (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                               *(undefined8 *)
                                (*local_2058 +
                                ((long)(local_12fc - (int)local_2058[4]) +
                                 (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                 local_2058[1] +
                                (long)(local_1304 - (int)local_2058[5]) * local_2058[2]) * 8);
                          goto LAB_0135dc21;
                        }
                      }
                      local_498 = local_2068;
                      local_49c = 1;
                      if ((local_2068[1] & 1) != 0) {
                        local_4a8 = local_2070;
                        local_4ac = 2;
                        if ((local_2070[2] & 1) != 0) {
                          local_1330 = local_2140 + 1 + local_2094;
                          local_1334 = (local_213c + -1) - local_2094;
                          local_1328 = local_2058;
                          local_132c = local_2144;
                          local_1340 = local_2058;
                          local_1344 = local_2144;
                          local_1348 = local_2140;
                          local_134c = local_213c;
                          *(undefined8 *)
                           (*local_2058 +
                           ((long)(local_2144 - (int)local_2058[4]) +
                            (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                           (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                               *(undefined8 *)
                                (*local_2058 +
                                ((long)(local_2144 - (int)local_2058[4]) +
                                 (long)(local_1330 - *(int *)((long)local_2058 + 0x24)) *
                                 local_2058[1] +
                                (long)(local_1334 - (int)local_2058[5]) * local_2058[2]) * 8);
                          goto LAB_0135dc21;
                        }
                      }
                      local_4b8 = local_2068;
                      local_4bc = 0;
                      if ((*local_2068 & 1) == 0) {
                        local_4c8 = local_2068;
                        local_4cc = 1;
                        if ((local_2068[1] & 1) == 0) {
                          local_4d8 = local_2070;
                          local_4dc = 2;
                          if ((local_2070[2] & 1) != 0) {
                            local_13c4 = (local_213c + -1) - local_2094;
                            local_13b8 = local_2058;
                            local_13bc = local_2144;
                            local_13c0 = local_2140;
                            local_13d0 = local_2058;
                            local_13d4 = local_2144;
                            local_13d8 = local_2140;
                            local_13dc = local_213c;
                            *(undefined8 *)
                             (*local_2058 +
                             ((long)(local_2144 - (int)local_2058[4]) +
                              (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                             + (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                 *(undefined8 *)
                                  (*local_2058 +
                                  ((long)(local_2144 - (int)local_2058[4]) +
                                   (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                   local_2058[1] +
                                  (long)(local_13c4 - (int)local_2058[5]) * local_2058[2]) * 8);
                          }
                        }
                        else {
                          local_1390 = local_2140 + 1 + local_2094;
                          local_1388 = local_2058;
                          local_138c = local_2144;
                          local_1394 = local_213c;
                          local_13a0 = local_2058;
                          local_13a4 = local_2144;
                          local_13a8 = local_2140;
                          local_13ac = local_213c;
                          *(undefined8 *)
                           (*local_2058 +
                           ((long)(local_2144 - (int)local_2058[4]) +
                            (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                           (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                               *(undefined8 *)
                                (*local_2058 +
                                ((long)(local_2144 - (int)local_2058[4]) +
                                 (long)(local_1390 - *(int *)((long)local_2058 + 0x24)) *
                                 local_2058[1] +
                                (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8);
                        }
                      }
                      else {
                        local_135c = local_2144 + 1 + local_2094;
                        local_1358 = local_2058;
                        local_1360 = local_2140;
                        local_1364 = local_213c;
                        local_1370 = local_2058;
                        local_1374 = local_2144;
                        local_1378 = local_2140;
                        local_137c = local_213c;
                        *(undefined8 *)
                         (*local_2058 +
                         ((long)(local_2144 - (int)local_2058[4]) +
                          (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                         (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                             *(undefined8 *)
                              (*local_2058 +
                              ((long)(local_135c - (int)local_2058[4]) +
                               (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                               local_2058[1] +
                              (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8);
                      }
                    }
                    else {
LAB_01357f46:
                      if (((local_2144 == (int)local_20c0 + 1) &&
                          (local_2140 == local_20a0._4_4_ + -1)) && (local_213c == local_20b8 + 1))
                      {
                        local_4e8 = local_2070;
                        local_4ec = 0;
                        if ((*local_2070 & 1) == 0) {
                          local_4f8 = local_2068;
                          local_4fc = 1;
                          if ((local_2068[1] & 1) == 0) {
                            local_508 = local_2070;
                            local_50c = 2;
                            if ((local_2070[2] & 1) == 0) goto LAB_013589d2;
                          }
                        }
                        local_518 = local_2070;
                        local_51c = 0;
                        if ((*local_2070 & 1) != 0) {
                          local_528 = local_2068;
                          local_52c = 1;
                          if ((local_2068[1] & 1) != 0) {
                            local_538 = local_2070;
                            local_53c = 2;
                            if ((local_2070[2] & 1) != 0) {
                              local_13ec = (local_2144 + -1) - local_2094;
                              local_13f0 = local_2140 + 1 + local_2094;
                              local_13f4 = (local_213c + -1) - local_2094;
                              local_13e8 = local_2058;
                              local_1400 = local_2058;
                              local_1404 = local_2144;
                              local_1408 = local_2140;
                              local_140c = local_213c;
                              *(undefined8 *)
                               (*local_2058 +
                               ((long)(local_2144 - (int)local_2058[4]) +
                                (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                local_2058[1] +
                               (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                   *(undefined8 *)
                                    (*local_2058 +
                                    ((long)(local_13ec - (int)local_2058[4]) +
                                     (long)(local_13f0 - *(int *)((long)local_2058 + 0x24)) *
                                     local_2058[1] +
                                    (long)(local_13f4 - (int)local_2058[5]) * local_2058[2]) * 8);
                              goto LAB_0135dc21;
                            }
                          }
                        }
                        local_548 = local_2070;
                        local_54c = 0;
                        if ((*local_2070 & 1) != 0) {
                          local_558 = local_2068;
                          local_55c = 1;
                          if ((local_2068[1] & 1) != 0) {
                            local_141c = (local_2144 + -1) - local_2094;
                            local_1420 = local_2140 + 1 + local_2094;
                            local_1418 = local_2058;
                            local_1424 = local_213c;
                            local_1430 = local_2058;
                            local_1434 = local_2144;
                            local_1438 = local_2140;
                            local_143c = local_213c;
                            *(undefined8 *)
                             (*local_2058 +
                             ((long)(local_2144 - (int)local_2058[4]) +
                              (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                             + (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                 *(undefined8 *)
                                  (*local_2058 +
                                  ((long)(local_141c - (int)local_2058[4]) +
                                   (long)(local_1420 - *(int *)((long)local_2058 + 0x24)) *
                                   local_2058[1] +
                                  (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8);
                            goto LAB_0135dc21;
                          }
                        }
                        local_568 = local_2070;
                        local_56c = 0;
                        if ((*local_2070 & 1) != 0) {
                          local_578 = local_2070;
                          local_57c = 2;
                          if ((local_2070[2] & 1) != 0) {
                            local_144c = (local_2144 + -1) - local_2094;
                            local_1454 = (local_213c + -1) - local_2094;
                            local_1448 = local_2058;
                            local_1450 = local_2140;
                            local_1460 = local_2058;
                            local_1464 = local_2144;
                            local_1468 = local_2140;
                            local_146c = local_213c;
                            *(undefined8 *)
                             (*local_2058 +
                             ((long)(local_2144 - (int)local_2058[4]) +
                              (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                             + (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                 *(undefined8 *)
                                  (*local_2058 +
                                  ((long)(local_144c - (int)local_2058[4]) +
                                   (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                   local_2058[1] +
                                  (long)(local_1454 - (int)local_2058[5]) * local_2058[2]) * 8);
                            goto LAB_0135dc21;
                          }
                        }
                        local_588 = local_2068;
                        local_58c = 1;
                        if ((local_2068[1] & 1) != 0) {
                          local_598 = local_2070;
                          local_59c = 2;
                          if ((local_2070[2] & 1) != 0) {
                            local_1480 = local_2140 + 1 + local_2094;
                            local_1484 = (local_213c + -1) - local_2094;
                            local_1478 = local_2058;
                            local_147c = local_2144;
                            local_1490 = local_2058;
                            local_1494 = local_2144;
                            local_1498 = local_2140;
                            local_149c = local_213c;
                            *(undefined8 *)
                             (*local_2058 +
                             ((long)(local_2144 - (int)local_2058[4]) +
                              (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                             + (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                 *(undefined8 *)
                                  (*local_2058 +
                                  ((long)(local_2144 - (int)local_2058[4]) +
                                   (long)(local_1480 - *(int *)((long)local_2058 + 0x24)) *
                                   local_2058[1] +
                                  (long)(local_1484 - (int)local_2058[5]) * local_2058[2]) * 8);
                            goto LAB_0135dc21;
                          }
                        }
                        local_5a8 = local_2070;
                        local_5ac = 0;
                        if ((*local_2070 & 1) == 0) {
                          local_5b8 = local_2068;
                          local_5bc = 1;
                          if ((local_2068[1] & 1) == 0) {
                            local_5c8 = local_2070;
                            local_5cc = 2;
                            if ((local_2070[2] & 1) != 0) {
                              local_1514 = (local_213c + -1) - local_2094;
                              local_1508 = local_2058;
                              local_150c = local_2144;
                              local_1510 = local_2140;
                              local_1520 = local_2058;
                              local_1524 = local_2144;
                              local_1528 = local_2140;
                              local_152c = local_213c;
                              *(undefined8 *)
                               (*local_2058 +
                               ((long)(local_2144 - (int)local_2058[4]) +
                                (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                local_2058[1] +
                               (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                   *(undefined8 *)
                                    (*local_2058 +
                                    ((long)(local_2144 - (int)local_2058[4]) +
                                     (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                     local_2058[1] +
                                    (long)(local_1514 - (int)local_2058[5]) * local_2058[2]) * 8);
                            }
                          }
                          else {
                            local_14e0 = local_2140 + 1 + local_2094;
                            local_14d8 = local_2058;
                            local_14dc = local_2144;
                            local_14e4 = local_213c;
                            local_14f0 = local_2058;
                            local_14f4 = local_2144;
                            local_14f8 = local_2140;
                            local_14fc = local_213c;
                            *(undefined8 *)
                             (*local_2058 +
                             ((long)(local_2144 - (int)local_2058[4]) +
                              (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                             + (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                 *(undefined8 *)
                                  (*local_2058 +
                                  ((long)(local_2144 - (int)local_2058[4]) +
                                   (long)(local_14e0 - *(int *)((long)local_2058 + 0x24)) *
                                   local_2058[1] +
                                  (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8);
                          }
                        }
                        else {
                          local_14ac = (local_2144 + -1) - local_2094;
                          local_14a8 = local_2058;
                          local_14b0 = local_2140;
                          local_14b4 = local_213c;
                          local_14c0 = local_2058;
                          local_14c4 = local_2144;
                          local_14c8 = local_2140;
                          local_14cc = local_213c;
                          *(undefined8 *)
                           (*local_2058 +
                           ((long)(local_2144 - (int)local_2058[4]) +
                            (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                           (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                               *(undefined8 *)
                                (*local_2058 +
                                ((long)(local_14ac - (int)local_2058[4]) +
                                 (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                 local_2058[1] +
                                (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8);
                        }
                      }
                      else {
LAB_013589d2:
                        if (((local_2144 == (int)local_20a0 + -1) &&
                            (local_2140 == local_20c0._4_4_ + 1)) && (local_213c == local_20b8 + 1))
                        {
                          local_5d8 = local_2068;
                          local_5dc = 0;
                          if ((*local_2068 & 1) == 0) {
                            local_5e8 = local_2070;
                            local_5ec = 1;
                            if ((local_2070[1] & 1) == 0) {
                              local_5f8 = local_2070;
                              local_5fc = 2;
                              if ((local_2070[2] & 1) == 0) goto LAB_0135945e;
                            }
                          }
                          local_608 = local_2068;
                          local_60c = 0;
                          if ((*local_2068 & 1) != 0) {
                            local_618 = local_2070;
                            local_61c = 1;
                            if ((local_2070[1] & 1) != 0) {
                              local_628 = local_2070;
                              local_62c = 2;
                              if ((local_2070[2] & 1) != 0) {
                                local_153c = local_2144 + 1 + local_2094;
                                local_1540 = (local_2140 + -1) - local_2094;
                                local_1544 = (local_213c + -1) - local_2094;
                                local_1538 = local_2058;
                                local_1550 = local_2058;
                                local_1554 = local_2144;
                                local_1558 = local_2140;
                                local_155c = local_213c;
                                *(undefined8 *)
                                 (*local_2058 +
                                 ((long)(local_2144 - (int)local_2058[4]) +
                                  (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                  local_2058[1] +
                                 (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                     *(undefined8 *)
                                      (*local_2058 +
                                      ((long)(local_153c - (int)local_2058[4]) +
                                       (long)(local_1540 - *(int *)((long)local_2058 + 0x24)) *
                                       local_2058[1] +
                                      (long)(local_1544 - (int)local_2058[5]) * local_2058[2]) * 8);
                                goto LAB_0135dc21;
                              }
                            }
                          }
                          local_638 = local_2068;
                          local_63c = 0;
                          if ((*local_2068 & 1) != 0) {
                            local_648 = local_2070;
                            local_64c = 1;
                            if ((local_2070[1] & 1) != 0) {
                              local_156c = local_2144 + 1 + local_2094;
                              local_1570 = (local_2140 + -1) - local_2094;
                              local_1568 = local_2058;
                              local_1574 = local_213c;
                              local_1580 = local_2058;
                              local_1584 = local_2144;
                              local_1588 = local_2140;
                              local_158c = local_213c;
                              *(undefined8 *)
                               (*local_2058 +
                               ((long)(local_2144 - (int)local_2058[4]) +
                                (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                local_2058[1] +
                               (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                   *(undefined8 *)
                                    (*local_2058 +
                                    ((long)(local_156c - (int)local_2058[4]) +
                                     (long)(local_1570 - *(int *)((long)local_2058 + 0x24)) *
                                     local_2058[1] +
                                    (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8);
                              goto LAB_0135dc21;
                            }
                          }
                          local_658 = local_2068;
                          local_65c = 0;
                          if ((*local_2068 & 1) != 0) {
                            local_668 = local_2070;
                            local_66c = 2;
                            if ((local_2070[2] & 1) != 0) {
                              local_159c = local_2144 + 1 + local_2094;
                              local_15a4 = (local_213c + -1) - local_2094;
                              local_1598 = local_2058;
                              local_15a0 = local_2140;
                              local_15b0 = local_2058;
                              local_15b4 = local_2144;
                              local_15b8 = local_2140;
                              local_15bc = local_213c;
                              *(undefined8 *)
                               (*local_2058 +
                               ((long)(local_2144 - (int)local_2058[4]) +
                                (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                local_2058[1] +
                               (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                   *(undefined8 *)
                                    (*local_2058 +
                                    ((long)(local_159c - (int)local_2058[4]) +
                                     (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                     local_2058[1] +
                                    (long)(local_15a4 - (int)local_2058[5]) * local_2058[2]) * 8);
                              goto LAB_0135dc21;
                            }
                          }
                          local_678 = local_2070;
                          local_67c = 1;
                          if ((local_2070[1] & 1) != 0) {
                            local_688 = local_2070;
                            local_68c = 2;
                            if ((local_2070[2] & 1) != 0) {
                              local_15d0 = (local_2140 + -1) - local_2094;
                              local_15d4 = (local_213c + -1) - local_2094;
                              local_15c8 = local_2058;
                              local_15cc = local_2144;
                              local_15e0 = local_2058;
                              local_15e4 = local_2144;
                              local_15e8 = local_2140;
                              local_15ec = local_213c;
                              *(undefined8 *)
                               (*local_2058 +
                               ((long)(local_2144 - (int)local_2058[4]) +
                                (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                local_2058[1] +
                               (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                   *(undefined8 *)
                                    (*local_2058 +
                                    ((long)(local_2144 - (int)local_2058[4]) +
                                     (long)(local_15d0 - *(int *)((long)local_2058 + 0x24)) *
                                     local_2058[1] +
                                    (long)(local_15d4 - (int)local_2058[5]) * local_2058[2]) * 8);
                              goto LAB_0135dc21;
                            }
                          }
                          local_698 = local_2068;
                          local_69c = 0;
                          if ((*local_2068 & 1) == 0) {
                            local_6a8 = local_2070;
                            local_6ac = 1;
                            if ((local_2070[1] & 1) == 0) {
                              local_6b8 = local_2070;
                              local_6bc = 2;
                              if ((local_2070[2] & 1) != 0) {
                                local_1664 = (local_213c + -1) - local_2094;
                                local_1658 = local_2058;
                                local_165c = local_2144;
                                local_1660 = local_2140;
                                local_1670 = local_2058;
                                local_1674 = local_2144;
                                local_1678 = local_2140;
                                local_167c = local_213c;
                                *(undefined8 *)
                                 (*local_2058 +
                                 ((long)(local_2144 - (int)local_2058[4]) +
                                  (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                  local_2058[1] +
                                 (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                     *(undefined8 *)
                                      (*local_2058 +
                                      ((long)(local_2144 - (int)local_2058[4]) +
                                       (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                       local_2058[1] +
                                      (long)(local_1664 - (int)local_2058[5]) * local_2058[2]) * 8);
                              }
                            }
                            else {
                              local_1630 = (local_2140 + -1) - local_2094;
                              local_1628 = local_2058;
                              local_162c = local_2144;
                              local_1634 = local_213c;
                              local_1640 = local_2058;
                              local_1644 = local_2144;
                              local_1648 = local_2140;
                              local_164c = local_213c;
                              *(undefined8 *)
                               (*local_2058 +
                               ((long)(local_2144 - (int)local_2058[4]) +
                                (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                local_2058[1] +
                               (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                   *(undefined8 *)
                                    (*local_2058 +
                                    ((long)(local_2144 - (int)local_2058[4]) +
                                     (long)(local_1630 - *(int *)((long)local_2058 + 0x24)) *
                                     local_2058[1] +
                                    (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8);
                            }
                          }
                          else {
                            local_15fc = local_2144 + 1 + local_2094;
                            local_15f8 = local_2058;
                            local_1600 = local_2140;
                            local_1604 = local_213c;
                            local_1610 = local_2058;
                            local_1614 = local_2144;
                            local_1618 = local_2140;
                            local_161c = local_213c;
                            *(undefined8 *)
                             (*local_2058 +
                             ((long)(local_2144 - (int)local_2058[4]) +
                              (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                             + (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                 *(undefined8 *)
                                  (*local_2058 +
                                  ((long)(local_15fc - (int)local_2058[4]) +
                                   (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                   local_2058[1] +
                                  (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8);
                          }
                        }
                        else {
LAB_0135945e:
                          if (((local_2144 == (int)local_20c0 + 1) &&
                              (local_2140 == local_20c0._4_4_ + 1)) &&
                             (local_213c == local_20b8 + 1)) {
                            local_6c8 = local_2070;
                            local_6cc = 0;
                            if ((*local_2070 & 1) == 0) {
                              local_6d8 = local_2070;
                              local_6dc = 1;
                              if ((local_2070[1] & 1) == 0) {
                                local_6e8 = local_2070;
                                local_6ec = 2;
                                if ((local_2070[2] & 1) == 0) goto LAB_01359eea;
                              }
                            }
                            local_6f8 = local_2070;
                            local_6fc = 0;
                            if ((*local_2070 & 1) != 0) {
                              local_708 = local_2070;
                              local_70c = 1;
                              if ((local_2070[1] & 1) != 0) {
                                local_718 = local_2070;
                                local_71c = 2;
                                if ((local_2070[2] & 1) != 0) {
                                  local_168c = (local_2144 + -1) - local_2094;
                                  local_1690 = (local_2140 + -1) - local_2094;
                                  local_1694 = (local_213c + -1) - local_2094;
                                  local_1688 = local_2058;
                                  local_16a0 = local_2058;
                                  local_16a4 = local_2144;
                                  local_16a8 = local_2140;
                                  local_16ac = local_213c;
                                  *(undefined8 *)
                                   (*local_2058 +
                                   ((long)(local_2144 - (int)local_2058[4]) +
                                    (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                    local_2058[1] +
                                   (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                       *(undefined8 *)
                                        (*local_2058 +
                                        ((long)(local_168c - (int)local_2058[4]) +
                                         (long)(local_1690 - *(int *)((long)local_2058 + 0x24)) *
                                         local_2058[1] +
                                        (long)(local_1694 - (int)local_2058[5]) * local_2058[2]) * 8
                                        );
                                  goto LAB_0135dc21;
                                }
                              }
                            }
                            local_728 = local_2070;
                            local_72c = 0;
                            if ((*local_2070 & 1) != 0) {
                              local_738 = local_2070;
                              local_73c = 1;
                              if ((local_2070[1] & 1) != 0) {
                                local_16bc = (local_2144 + -1) - local_2094;
                                local_16c0 = (local_2140 + -1) - local_2094;
                                local_16b8 = local_2058;
                                local_16c4 = local_213c;
                                local_16d0 = local_2058;
                                local_16d4 = local_2144;
                                local_16d8 = local_2140;
                                local_16dc = local_213c;
                                *(undefined8 *)
                                 (*local_2058 +
                                 ((long)(local_2144 - (int)local_2058[4]) +
                                  (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                  local_2058[1] +
                                 (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                     *(undefined8 *)
                                      (*local_2058 +
                                      ((long)(local_16bc - (int)local_2058[4]) +
                                       (long)(local_16c0 - *(int *)((long)local_2058 + 0x24)) *
                                       local_2058[1] +
                                      (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8);
                                goto LAB_0135dc21;
                              }
                            }
                            local_748 = local_2070;
                            local_74c = 0;
                            if ((*local_2070 & 1) != 0) {
                              local_758 = local_2070;
                              local_75c = 2;
                              if ((local_2070[2] & 1) != 0) {
                                local_16ec = (local_2144 + -1) - local_2094;
                                local_16f4 = (local_213c + -1) - local_2094;
                                local_16e8 = local_2058;
                                local_16f0 = local_2140;
                                local_1700 = local_2058;
                                local_1704 = local_2144;
                                local_1708 = local_2140;
                                local_170c = local_213c;
                                *(undefined8 *)
                                 (*local_2058 +
                                 ((long)(local_2144 - (int)local_2058[4]) +
                                  (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                  local_2058[1] +
                                 (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                     *(undefined8 *)
                                      (*local_2058 +
                                      ((long)(local_16ec - (int)local_2058[4]) +
                                       (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                       local_2058[1] +
                                      (long)(local_16f4 - (int)local_2058[5]) * local_2058[2]) * 8);
                                goto LAB_0135dc21;
                              }
                            }
                            local_768 = local_2070;
                            local_76c = 1;
                            if ((local_2070[1] & 1) != 0) {
                              local_778 = local_2070;
                              local_77c = 2;
                              if ((local_2070[2] & 1) != 0) {
                                local_1720 = (local_2140 + -1) - local_2094;
                                local_1724 = (local_213c + -1) - local_2094;
                                local_1718 = local_2058;
                                local_171c = local_2144;
                                local_1730 = local_2058;
                                local_1734 = local_2144;
                                local_1738 = local_2140;
                                local_173c = local_213c;
                                *(undefined8 *)
                                 (*local_2058 +
                                 ((long)(local_2144 - (int)local_2058[4]) +
                                  (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                  local_2058[1] +
                                 (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                     *(undefined8 *)
                                      (*local_2058 +
                                      ((long)(local_2144 - (int)local_2058[4]) +
                                       (long)(local_1720 - *(int *)((long)local_2058 + 0x24)) *
                                       local_2058[1] +
                                      (long)(local_1724 - (int)local_2058[5]) * local_2058[2]) * 8);
                                goto LAB_0135dc21;
                              }
                            }
                            local_788 = local_2070;
                            local_78c = 0;
                            if ((*local_2070 & 1) == 0) {
                              local_798 = local_2070;
                              local_79c = 1;
                              if ((local_2070[1] & 1) == 0) {
                                local_7a8 = local_2070;
                                local_7ac = 2;
                                if ((local_2070[2] & 1) != 0) {
                                  local_17b4 = (local_213c + -1) - local_2094;
                                  local_17a8 = local_2058;
                                  local_17ac = local_2144;
                                  local_17b0 = local_2140;
                                  local_17c0 = local_2058;
                                  local_17c4 = local_2144;
                                  local_17c8 = local_2140;
                                  local_17cc = local_213c;
                                  *(undefined8 *)
                                   (*local_2058 +
                                   ((long)(local_2144 - (int)local_2058[4]) +
                                    (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                    local_2058[1] +
                                   (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                       *(undefined8 *)
                                        (*local_2058 +
                                        ((long)(local_2144 - (int)local_2058[4]) +
                                         (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                         local_2058[1] +
                                        (long)(local_17b4 - (int)local_2058[5]) * local_2058[2]) * 8
                                        );
                                }
                              }
                              else {
                                local_1780 = (local_2140 + -1) - local_2094;
                                local_1778 = local_2058;
                                local_177c = local_2144;
                                local_1784 = local_213c;
                                local_1790 = local_2058;
                                local_1794 = local_2144;
                                local_1798 = local_2140;
                                local_179c = local_213c;
                                *(undefined8 *)
                                 (*local_2058 +
                                 ((long)(local_2144 - (int)local_2058[4]) +
                                  (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                  local_2058[1] +
                                 (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                     *(undefined8 *)
                                      (*local_2058 +
                                      ((long)(local_2144 - (int)local_2058[4]) +
                                       (long)(local_1780 - *(int *)((long)local_2058 + 0x24)) *
                                       local_2058[1] +
                                      (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8);
                              }
                            }
                            else {
                              local_174c = (local_2144 + -1) - local_2094;
                              local_1748 = local_2058;
                              local_1750 = local_2140;
                              local_1754 = local_213c;
                              local_1760 = local_2058;
                              local_1764 = local_2144;
                              local_1768 = local_2140;
                              local_176c = local_213c;
                              *(undefined8 *)
                               (*local_2058 +
                               ((long)(local_2144 - (int)local_2058[4]) +
                                (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                local_2058[1] +
                               (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                   *(undefined8 *)
                                    (*local_2058 +
                                    ((long)(local_174c - (int)local_2058[4]) +
                                     (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                     local_2058[1] +
                                    (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8);
                            }
                          }
                          else {
LAB_01359eea:
                            if ((local_2144 == (int)local_20a0 + -1) &&
                               (local_2140 == local_20a0._4_4_ + -1)) {
                              local_7b8 = local_2068;
                              local_7bc = 0;
                              if ((*local_2068 & 1) == 0) {
                                local_7c8 = local_2068;
                                local_7cc = 1;
                                if ((local_2068[1] & 1) == 0) goto LAB_0135a35b;
                              }
                              local_7d8 = local_2068;
                              local_7dc = 0;
                              if ((*local_2068 & 1) != 0) {
                                local_7e8 = local_2068;
                                local_7ec = 1;
                                if ((local_2068[1] & 1) != 0) {
                                  local_17dc = local_2144 + 1 + local_2094;
                                  local_17e0 = local_2140 + 1 + local_2094;
                                  local_17d8 = local_2058;
                                  local_17e4 = local_213c;
                                  local_17f0 = local_2058;
                                  local_17f4 = local_2144;
                                  local_17f8 = local_2140;
                                  local_17fc = local_213c;
                                  *(undefined8 *)
                                   (*local_2058 +
                                   ((long)(local_2144 - (int)local_2058[4]) +
                                    (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                    local_2058[1] +
                                   (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                       *(undefined8 *)
                                        (*local_2058 +
                                        ((long)(local_17dc - (int)local_2058[4]) +
                                         (long)(local_17e0 - *(int *)((long)local_2058 + 0x24)) *
                                         local_2058[1] +
                                        (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8
                                        );
                                  goto LAB_0135dc21;
                                }
                              }
                              local_7f8 = local_2068;
                              local_7fc = 0;
                              if ((*local_2068 & 1) == 0) {
                                local_808 = local_2068;
                                local_80c = 1;
                                if ((local_2068[1] & 1) != 0) {
                                  local_1840 = local_2140 + 1 + local_2094;
                                  local_1838 = local_2058;
                                  local_183c = local_2144;
                                  local_1844 = local_213c;
                                  local_1850 = local_2058;
                                  local_1854 = local_2144;
                                  local_1858 = local_2140;
                                  local_185c = local_213c;
                                  *(undefined8 *)
                                   (*local_2058 +
                                   ((long)(local_2144 - (int)local_2058[4]) +
                                    (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                    local_2058[1] +
                                   (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                       *(undefined8 *)
                                        (*local_2058 +
                                        ((long)(local_2144 - (int)local_2058[4]) +
                                         (long)(local_1840 - *(int *)((long)local_2058 + 0x24)) *
                                         local_2058[1] +
                                        (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8
                                        );
                                }
                              }
                              else {
                                local_180c = local_2144 + 1 + local_2094;
                                local_1808 = local_2058;
                                local_1810 = local_2140;
                                local_1814 = local_213c;
                                local_1820 = local_2058;
                                local_1824 = local_2144;
                                local_1828 = local_2140;
                                local_182c = local_213c;
                                *(undefined8 *)
                                 (*local_2058 +
                                 ((long)(local_2144 - (int)local_2058[4]) +
                                  (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                  local_2058[1] +
                                 (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                     *(undefined8 *)
                                      (*local_2058 +
                                      ((long)(local_180c - (int)local_2058[4]) +
                                       (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                       local_2058[1] +
                                      (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8);
                              }
                            }
                            else {
LAB_0135a35b:
                              if ((local_2144 == (int)local_20c0 + 1) &&
                                 (local_2140 == local_20a0._4_4_ + -1)) {
                                local_818 = local_2070;
                                local_81c = 0;
                                if ((*local_2070 & 1) == 0) {
                                  local_828 = local_2068;
                                  local_82c = 1;
                                  if ((local_2068[1] & 1) == 0) goto LAB_0135a7cc;
                                }
                                local_838 = local_2070;
                                local_83c = 0;
                                if ((*local_2070 & 1) != 0) {
                                  local_848 = local_2068;
                                  local_84c = 1;
                                  if ((local_2068[1] & 1) != 0) {
                                    local_186c = (local_2144 + -1) - local_2094;
                                    local_1870 = local_2140 + 1 + local_2094;
                                    local_1868 = local_2058;
                                    local_1874 = local_213c;
                                    local_1880 = local_2058;
                                    local_1884 = local_2144;
                                    local_1888 = local_2140;
                                    local_188c = local_213c;
                                    *(undefined8 *)
                                     (*local_2058 +
                                     ((long)(local_2144 - (int)local_2058[4]) +
                                      (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                      local_2058[1] +
                                     (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                         *(undefined8 *)
                                          (*local_2058 +
                                          ((long)(local_186c - (int)local_2058[4]) +
                                           (long)(local_1870 - *(int *)((long)local_2058 + 0x24)) *
                                           local_2058[1] +
                                          (long)(local_213c - (int)local_2058[5]) * local_2058[2]) *
                                          8);
                                    goto LAB_0135dc21;
                                  }
                                }
                                local_858 = local_2070;
                                local_85c = 0;
                                if ((*local_2070 & 1) == 0) {
                                  local_868 = local_2068;
                                  local_86c = 1;
                                  if ((local_2068[1] & 1) != 0) {
                                    local_18d0 = local_2140 + 1 + local_2094;
                                    local_18c8 = local_2058;
                                    local_18cc = local_2144;
                                    local_18d4 = local_213c;
                                    local_18e0 = local_2058;
                                    local_18e4 = local_2144;
                                    local_18e8 = local_2140;
                                    local_18ec = local_213c;
                                    *(undefined8 *)
                                     (*local_2058 +
                                     ((long)(local_2144 - (int)local_2058[4]) +
                                      (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                      local_2058[1] +
                                     (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                         *(undefined8 *)
                                          (*local_2058 +
                                          ((long)(local_2144 - (int)local_2058[4]) +
                                           (long)(local_18d0 - *(int *)((long)local_2058 + 0x24)) *
                                           local_2058[1] +
                                          (long)(local_213c - (int)local_2058[5]) * local_2058[2]) *
                                          8);
                                  }
                                }
                                else {
                                  local_189c = (local_2144 + -1) - local_2094;
                                  local_1898 = local_2058;
                                  local_18a0 = local_2140;
                                  local_18a4 = local_213c;
                                  local_18b0 = local_2058;
                                  local_18b4 = local_2144;
                                  local_18b8 = local_2140;
                                  local_18bc = local_213c;
                                  *(undefined8 *)
                                   (*local_2058 +
                                   ((long)(local_2144 - (int)local_2058[4]) +
                                    (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                    local_2058[1] +
                                   (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                       *(undefined8 *)
                                        (*local_2058 +
                                        ((long)(local_189c - (int)local_2058[4]) +
                                         (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                         local_2058[1] +
                                        (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8
                                        );
                                }
                              }
                              else {
LAB_0135a7cc:
                                if ((local_2144 == (int)local_20a0 + -1) &&
                                   (local_2140 == local_20c0._4_4_ + 1)) {
                                  local_878 = local_2068;
                                  local_87c = 0;
                                  if ((*local_2068 & 1) == 0) {
                                    local_888 = local_2070;
                                    local_88c = 1;
                                    if ((local_2070[1] & 1) == 0) goto LAB_0135ac3d;
                                  }
                                  local_898 = local_2068;
                                  local_89c = 0;
                                  if ((*local_2068 & 1) != 0) {
                                    local_8a8 = local_2070;
                                    local_8ac = 1;
                                    if ((local_2070[1] & 1) != 0) {
                                      local_18fc = local_2144 + 1 + local_2094;
                                      local_1900 = (local_2140 + -1) - local_2094;
                                      local_18f8 = local_2058;
                                      local_1904 = local_213c;
                                      local_1910 = local_2058;
                                      local_1914 = local_2144;
                                      local_1918 = local_2140;
                                      local_191c = local_213c;
                                      *(undefined8 *)
                                       (*local_2058 +
                                       ((long)(local_2144 - (int)local_2058[4]) +
                                        (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                        local_2058[1] +
                                       (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8)
                                           = *(undefined8 *)
                                              (*local_2058 +
                                              ((long)(local_18fc - (int)local_2058[4]) +
                                               (long)(local_1900 - *(int *)((long)local_2058 + 0x24)
                                                     ) * local_2058[1] +
                                              (long)(local_213c - (int)local_2058[5]) *
                                              local_2058[2]) * 8);
                                      goto LAB_0135dc21;
                                    }
                                  }
                                  local_8b8 = local_2068;
                                  local_8bc = 0;
                                  if ((*local_2068 & 1) == 0) {
                                    local_8c8 = local_2070;
                                    local_8cc = 1;
                                    if ((local_2070[1] & 1) != 0) {
                                      local_1960 = (local_2140 + -1) - local_2094;
                                      local_1958 = local_2058;
                                      local_195c = local_2144;
                                      local_1964 = local_213c;
                                      local_1970 = local_2058;
                                      local_1974 = local_2144;
                                      local_1978 = local_2140;
                                      local_197c = local_213c;
                                      *(undefined8 *)
                                       (*local_2058 +
                                       ((long)(local_2144 - (int)local_2058[4]) +
                                        (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                        local_2058[1] +
                                       (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8)
                                           = *(undefined8 *)
                                              (*local_2058 +
                                              ((long)(local_2144 - (int)local_2058[4]) +
                                               (long)(local_1960 - *(int *)((long)local_2058 + 0x24)
                                                     ) * local_2058[1] +
                                              (long)(local_213c - (int)local_2058[5]) *
                                              local_2058[2]) * 8);
                                    }
                                  }
                                  else {
                                    local_192c = local_2144 + 1 + local_2094;
                                    local_1928 = local_2058;
                                    local_1930 = local_2140;
                                    local_1934 = local_213c;
                                    local_1940 = local_2058;
                                    local_1944 = local_2144;
                                    local_1948 = local_2140;
                                    local_194c = local_213c;
                                    *(undefined8 *)
                                     (*local_2058 +
                                     ((long)(local_2144 - (int)local_2058[4]) +
                                      (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                      local_2058[1] +
                                     (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8) =
                                         *(undefined8 *)
                                          (*local_2058 +
                                          ((long)(local_192c - (int)local_2058[4]) +
                                           (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                           local_2058[1] +
                                          (long)(local_213c - (int)local_2058[5]) * local_2058[2]) *
                                          8);
                                  }
                                }
                                else {
LAB_0135ac3d:
                                  if ((local_2144 == (int)local_20c0 + 1) &&
                                     (local_2140 == local_20c0._4_4_ + 1)) {
                                    local_8d8 = local_2070;
                                    local_8dc = 0;
                                    if ((*local_2070 & 1) == 0) {
                                      local_8e8 = local_2070;
                                      local_8ec = 1;
                                      if ((local_2070[1] & 1) == 0) goto LAB_0135b0ae;
                                    }
                                    local_8f8 = local_2070;
                                    local_8fc = 0;
                                    if ((*local_2070 & 1) != 0) {
                                      local_908 = local_2070;
                                      local_90c = 1;
                                      if ((local_2070[1] & 1) != 0) {
                                        local_198c = (local_2144 + -1) - local_2094;
                                        local_1990 = (local_2140 + -1) - local_2094;
                                        local_1988 = local_2058;
                                        local_1994 = local_213c;
                                        local_19a0 = local_2058;
                                        local_19a4 = local_2144;
                                        local_19a8 = local_2140;
                                        local_19ac = local_213c;
                                        *(undefined8 *)
                                         (*local_2058 +
                                         ((long)(local_2144 - (int)local_2058[4]) +
                                          (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                          local_2058[1] +
                                         (long)(local_213c - (int)local_2058[5]) * local_2058[2]) *
                                         8) = *(undefined8 *)
                                               (*local_2058 +
                                               ((long)(local_198c - (int)local_2058[4]) +
                                                (long)(local_1990 -
                                                      *(int *)((long)local_2058 + 0x24)) *
                                                local_2058[1] +
                                               (long)(local_213c - (int)local_2058[5]) *
                                               local_2058[2]) * 8);
                                        goto LAB_0135dc21;
                                      }
                                    }
                                    local_918 = local_2070;
                                    local_91c = 0;
                                    if ((*local_2070 & 1) == 0) {
                                      local_928 = local_2070;
                                      local_92c = 1;
                                      if ((local_2070[1] & 1) != 0) {
                                        local_19f0 = (local_2140 + -1) - local_2094;
                                        local_19e8 = local_2058;
                                        local_19ec = local_2144;
                                        local_19f4 = local_213c;
                                        local_1a00 = local_2058;
                                        local_1a04 = local_2144;
                                        local_1a08 = local_2140;
                                        local_1a0c = local_213c;
                                        *(undefined8 *)
                                         (*local_2058 +
                                         ((long)(local_2144 - (int)local_2058[4]) +
                                          (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                          local_2058[1] +
                                         (long)(local_213c - (int)local_2058[5]) * local_2058[2]) *
                                         8) = *(undefined8 *)
                                               (*local_2058 +
                                               ((long)(local_2144 - (int)local_2058[4]) +
                                                (long)(local_19f0 -
                                                      *(int *)((long)local_2058 + 0x24)) *
                                                local_2058[1] +
                                               (long)(local_213c - (int)local_2058[5]) *
                                               local_2058[2]) * 8);
                                      }
                                    }
                                    else {
                                      local_19bc = (local_2144 + -1) - local_2094;
                                      local_19b8 = local_2058;
                                      local_19c0 = local_2140;
                                      local_19c4 = local_213c;
                                      local_19d0 = local_2058;
                                      local_19d4 = local_2144;
                                      local_19d8 = local_2140;
                                      local_19dc = local_213c;
                                      *(undefined8 *)
                                       (*local_2058 +
                                       ((long)(local_2144 - (int)local_2058[4]) +
                                        (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                        local_2058[1] +
                                       (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 8)
                                           = *(undefined8 *)
                                              (*local_2058 +
                                              ((long)(local_19bc - (int)local_2058[4]) +
                                               (long)(local_2140 - *(int *)((long)local_2058 + 0x24)
                                                     ) * local_2058[1] +
                                              (long)(local_213c - (int)local_2058[5]) *
                                              local_2058[2]) * 8);
                                    }
                                  }
                                  else {
LAB_0135b0ae:
                                    if ((local_2144 == (int)local_20a0 + -1) &&
                                       (local_213c == local_2098 + -1)) {
                                      local_938 = local_2068;
                                      local_93c = 0;
                                      if ((*local_2068 & 1) == 0) {
                                        local_948 = local_2068;
                                        local_94c = 2;
                                        if ((local_2068[2] & 1) == 0) goto LAB_0135b51f;
                                      }
                                      local_958 = local_2068;
                                      local_95c = 0;
                                      if ((*local_2068 & 1) != 0) {
                                        local_968 = local_2068;
                                        local_96c = 2;
                                        if ((local_2068[2] & 1) != 0) {
                                          local_1a1c = local_2144 + 1 + local_2094;
                                          local_1a24 = local_213c + 1 + local_2094;
                                          local_1a18 = local_2058;
                                          local_1a20 = local_2140;
                                          local_1a30 = local_2058;
                                          local_1a34 = local_2144;
                                          local_1a38 = local_2140;
                                          local_1a3c = local_213c;
                                          *(undefined8 *)
                                           (*local_2058 +
                                           ((long)(local_2144 - (int)local_2058[4]) +
                                            (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                            local_2058[1] +
                                           (long)(local_213c - (int)local_2058[5]) * local_2058[2])
                                           * 8) = *(undefined8 *)
                                                   (*local_2058 +
                                                   ((long)(local_1a1c - (int)local_2058[4]) +
                                                    (long)(local_2140 -
                                                          *(int *)((long)local_2058 + 0x24)) *
                                                    local_2058[1] +
                                                   (long)(local_1a24 - (int)local_2058[5]) *
                                                   local_2058[2]) * 8);
                                          goto LAB_0135dc21;
                                        }
                                      }
                                      local_978 = local_2068;
                                      local_97c = 0;
                                      if ((*local_2068 & 1) == 0) {
                                        local_988 = local_2068;
                                        local_98c = 2;
                                        if ((local_2068[2] & 1) != 0) {
                                          local_1a84 = local_213c + 1 + local_2094;
                                          local_1a78 = local_2058;
                                          local_1a7c = local_2144;
                                          local_1a80 = local_2140;
                                          local_1a90 = local_2058;
                                          local_1a94 = local_2144;
                                          local_1a98 = local_2140;
                                          local_1a9c = local_213c;
                                          *(undefined8 *)
                                           (*local_2058 +
                                           ((long)(local_2144 - (int)local_2058[4]) +
                                            (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                            local_2058[1] +
                                           (long)(local_213c - (int)local_2058[5]) * local_2058[2])
                                           * 8) = *(undefined8 *)
                                                   (*local_2058 +
                                                   ((long)(local_2144 - (int)local_2058[4]) +
                                                    (long)(local_2140 -
                                                          *(int *)((long)local_2058 + 0x24)) *
                                                    local_2058[1] +
                                                   (long)(local_1a84 - (int)local_2058[5]) *
                                                   local_2058[2]) * 8);
                                        }
                                      }
                                      else {
                                        local_1a4c = local_2144 + 1 + local_2094;
                                        local_1a48 = local_2058;
                                        local_1a50 = local_2140;
                                        local_1a54 = local_213c;
                                        local_1a60 = local_2058;
                                        local_1a64 = local_2144;
                                        local_1a68 = local_2140;
                                        local_1a6c = local_213c;
                                        *(undefined8 *)
                                         (*local_2058 +
                                         ((long)(local_2144 - (int)local_2058[4]) +
                                          (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                          local_2058[1] +
                                         (long)(local_213c - (int)local_2058[5]) * local_2058[2]) *
                                         8) = *(undefined8 *)
                                               (*local_2058 +
                                               ((long)(local_1a4c - (int)local_2058[4]) +
                                                (long)(local_2140 -
                                                      *(int *)((long)local_2058 + 0x24)) *
                                                local_2058[1] +
                                               (long)(local_213c - (int)local_2058[5]) *
                                               local_2058[2]) * 8);
                                      }
                                    }
                                    else {
LAB_0135b51f:
                                      if ((local_2144 == (int)local_20c0 + 1) &&
                                         (local_213c == local_2098 + -1)) {
                                        local_998 = local_2070;
                                        local_99c = 0;
                                        if ((*local_2070 & 1) == 0) {
                                          local_9a8 = local_2068;
                                          local_9ac = 2;
                                          if ((local_2068[2] & 1) == 0) goto LAB_0135b990;
                                        }
                                        local_9b8 = local_2070;
                                        local_9bc = 0;
                                        if ((*local_2070 & 1) != 0) {
                                          local_9c8 = local_2068;
                                          local_9cc = 2;
                                          if ((local_2068[2] & 1) != 0) {
                                            local_1aac = (local_2144 + -1) - local_2094;
                                            local_1ab4 = local_213c + 1 + local_2094;
                                            local_1aa8 = local_2058;
                                            local_1ab0 = local_2140;
                                            local_1ac0 = local_2058;
                                            local_1ac4 = local_2144;
                                            local_1ac8 = local_2140;
                                            local_1acc = local_213c;
                                            *(undefined8 *)
                                             (*local_2058 +
                                             ((long)(local_2144 - (int)local_2058[4]) +
                                              (long)(local_2140 - *(int *)((long)local_2058 + 0x24))
                                              * local_2058[1] +
                                             (long)(local_213c - (int)local_2058[5]) * local_2058[2]
                                             ) * 8) = *(undefined8 *)
                                                       (*local_2058 +
                                                       ((long)(local_1aac - (int)local_2058[4]) +
                                                        (long)(local_2140 -
                                                              *(int *)((long)local_2058 + 0x24)) *
                                                        local_2058[1] +
                                                       (long)(local_1ab4 - (int)local_2058[5]) *
                                                       local_2058[2]) * 8);
                                            goto LAB_0135dc21;
                                          }
                                        }
                                        local_9d8 = local_2070;
                                        local_9dc = 0;
                                        if ((*local_2070 & 1) == 0) {
                                          local_9e8 = local_2068;
                                          local_9ec = 2;
                                          if ((local_2068[2] & 1) != 0) {
                                            local_1b14 = local_213c + 1 + local_2094;
                                            local_1b08 = local_2058;
                                            local_1b0c = local_2144;
                                            local_1b10 = local_2140;
                                            local_1b20 = local_2058;
                                            local_1b24 = local_2144;
                                            local_1b28 = local_2140;
                                            local_1b2c = local_213c;
                                            *(undefined8 *)
                                             (*local_2058 +
                                             ((long)(local_2144 - (int)local_2058[4]) +
                                              (long)(local_2140 - *(int *)((long)local_2058 + 0x24))
                                              * local_2058[1] +
                                             (long)(local_213c - (int)local_2058[5]) * local_2058[2]
                                             ) * 8) = *(undefined8 *)
                                                       (*local_2058 +
                                                       ((long)(local_2144 - (int)local_2058[4]) +
                                                        (long)(local_2140 -
                                                              *(int *)((long)local_2058 + 0x24)) *
                                                        local_2058[1] +
                                                       (long)(local_1b14 - (int)local_2058[5]) *
                                                       local_2058[2]) * 8);
                                          }
                                        }
                                        else {
                                          local_1adc = (local_2144 + -1) - local_2094;
                                          local_1ad8 = local_2058;
                                          local_1ae0 = local_2140;
                                          local_1ae4 = local_213c;
                                          local_1af0 = local_2058;
                                          local_1af4 = local_2144;
                                          local_1af8 = local_2140;
                                          local_1afc = local_213c;
                                          *(undefined8 *)
                                           (*local_2058 +
                                           ((long)(local_2144 - (int)local_2058[4]) +
                                            (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                            local_2058[1] +
                                           (long)(local_213c - (int)local_2058[5]) * local_2058[2])
                                           * 8) = *(undefined8 *)
                                                   (*local_2058 +
                                                   ((long)(local_1adc - (int)local_2058[4]) +
                                                    (long)(local_2140 -
                                                          *(int *)((long)local_2058 + 0x24)) *
                                                    local_2058[1] +
                                                   (long)(local_213c - (int)local_2058[5]) *
                                                   local_2058[2]) * 8);
                                        }
                                      }
                                      else {
LAB_0135b990:
                                        if ((local_2144 == (int)local_20a0 + -1) &&
                                           (local_213c == local_20b8 + 1)) {
                                          local_9f8 = local_2068;
                                          local_9fc = 0;
                                          if ((*local_2068 & 1) == 0) {
                                            local_a08 = local_2070;
                                            local_a0c = 2;
                                            if ((local_2070[2] & 1) == 0) goto LAB_0135be01;
                                          }
                                          local_a18 = local_2068;
                                          local_a1c = 0;
                                          if ((*local_2068 & 1) != 0) {
                                            local_a28 = local_2070;
                                            local_a2c = 2;
                                            if ((local_2070[2] & 1) != 0) {
                                              local_1b3c = local_2144 + 1 + local_2094;
                                              local_1b44 = (local_213c + -1) - local_2094;
                                              local_1b38 = local_2058;
                                              local_1b40 = local_2140;
                                              local_1b50 = local_2058;
                                              local_1b54 = local_2144;
                                              local_1b58 = local_2140;
                                              local_1b5c = local_213c;
                                              *(undefined8 *)
                                               (*local_2058 +
                                               ((long)(local_2144 - (int)local_2058[4]) +
                                                (long)(local_2140 -
                                                      *(int *)((long)local_2058 + 0x24)) *
                                                local_2058[1] +
                                               (long)(local_213c - (int)local_2058[5]) *
                                               local_2058[2]) * 8) =
                                                   *(undefined8 *)
                                                    (*local_2058 +
                                                    ((long)(local_1b3c - (int)local_2058[4]) +
                                                     (long)(local_2140 -
                                                           *(int *)((long)local_2058 + 0x24)) *
                                                     local_2058[1] +
                                                    (long)(local_1b44 - (int)local_2058[5]) *
                                                    local_2058[2]) * 8);
                                              goto LAB_0135dc21;
                                            }
                                          }
                                          local_a38 = local_2068;
                                          local_a3c = 0;
                                          if ((*local_2068 & 1) == 0) {
                                            local_a48 = local_2070;
                                            local_a4c = 2;
                                            if ((local_2070[2] & 1) != 0) {
                                              local_1ba4 = (local_213c + -1) - local_2094;
                                              local_1b98 = local_2058;
                                              local_1b9c = local_2144;
                                              local_1ba0 = local_2140;
                                              local_1bb0 = local_2058;
                                              local_1bb4 = local_2144;
                                              local_1bb8 = local_2140;
                                              local_1bbc = local_213c;
                                              *(undefined8 *)
                                               (*local_2058 +
                                               ((long)(local_2144 - (int)local_2058[4]) +
                                                (long)(local_2140 -
                                                      *(int *)((long)local_2058 + 0x24)) *
                                                local_2058[1] +
                                               (long)(local_213c - (int)local_2058[5]) *
                                               local_2058[2]) * 8) =
                                                   *(undefined8 *)
                                                    (*local_2058 +
                                                    ((long)(local_2144 - (int)local_2058[4]) +
                                                     (long)(local_2140 -
                                                           *(int *)((long)local_2058 + 0x24)) *
                                                     local_2058[1] +
                                                    (long)(local_1ba4 - (int)local_2058[5]) *
                                                    local_2058[2]) * 8);
                                            }
                                          }
                                          else {
                                            local_1b6c = local_2144 + 1 + local_2094;
                                            local_1b68 = local_2058;
                                            local_1b70 = local_2140;
                                            local_1b74 = local_213c;
                                            local_1b80 = local_2058;
                                            local_1b84 = local_2144;
                                            local_1b88 = local_2140;
                                            local_1b8c = local_213c;
                                            *(undefined8 *)
                                             (*local_2058 +
                                             ((long)(local_2144 - (int)local_2058[4]) +
                                              (long)(local_2140 - *(int *)((long)local_2058 + 0x24))
                                              * local_2058[1] +
                                             (long)(local_213c - (int)local_2058[5]) * local_2058[2]
                                             ) * 8) = *(undefined8 *)
                                                       (*local_2058 +
                                                       ((long)(local_1b6c - (int)local_2058[4]) +
                                                        (long)(local_2140 -
                                                              *(int *)((long)local_2058 + 0x24)) *
                                                        local_2058[1] +
                                                       (long)(local_213c - (int)local_2058[5]) *
                                                       local_2058[2]) * 8);
                                          }
                                        }
                                        else {
LAB_0135be01:
                                          if ((local_2144 == (int)local_20c0 + 1) &&
                                             (local_213c == local_20b8 + 1)) {
                                            local_a58 = local_2070;
                                            local_a5c = 0;
                                            if ((*local_2070 & 1) == 0) {
                                              local_a68 = local_2070;
                                              local_a6c = 2;
                                              if ((local_2070[2] & 1) == 0) goto LAB_0135c272;
                                            }
                                            local_a78 = local_2070;
                                            local_a7c = 0;
                                            if ((*local_2070 & 1) != 0) {
                                              local_a88 = local_2070;
                                              local_a8c = 2;
                                              if ((local_2070[2] & 1) != 0) {
                                                local_1bcc = (local_2144 + -1) - local_2094;
                                                local_1bd4 = (local_213c + -1) - local_2094;
                                                local_1bc8 = local_2058;
                                                local_1bd0 = local_2140;
                                                local_1be0 = local_2058;
                                                local_1be4 = local_2144;
                                                local_1be8 = local_2140;
                                                local_1bec = local_213c;
                                                *(undefined8 *)
                                                 (*local_2058 +
                                                 ((long)(local_2144 - (int)local_2058[4]) +
                                                  (long)(local_2140 -
                                                        *(int *)((long)local_2058 + 0x24)) *
                                                  local_2058[1] +
                                                 (long)(local_213c - (int)local_2058[5]) *
                                                 local_2058[2]) * 8) =
                                                     *(undefined8 *)
                                                      (*local_2058 +
                                                      ((long)(local_1bcc - (int)local_2058[4]) +
                                                       (long)(local_2140 -
                                                             *(int *)((long)local_2058 + 0x24)) *
                                                       local_2058[1] +
                                                      (long)(local_1bd4 - (int)local_2058[5]) *
                                                      local_2058[2]) * 8);
                                                goto LAB_0135dc21;
                                              }
                                            }
                                            local_a98 = local_2070;
                                            local_a9c = 0;
                                            if ((*local_2070 & 1) == 0) {
                                              local_aa8 = local_2070;
                                              local_aac = 2;
                                              if ((local_2070[2] & 1) != 0) {
                                                local_1c34 = (local_213c + -1) - local_2094;
                                                local_1c28 = local_2058;
                                                local_1c2c = local_2144;
                                                local_1c30 = local_2140;
                                                local_1c40 = local_2058;
                                                local_1c44 = local_2144;
                                                local_1c48 = local_2140;
                                                local_1c4c = local_213c;
                                                *(undefined8 *)
                                                 (*local_2058 +
                                                 ((long)(local_2144 - (int)local_2058[4]) +
                                                  (long)(local_2140 -
                                                        *(int *)((long)local_2058 + 0x24)) *
                                                  local_2058[1] +
                                                 (long)(local_213c - (int)local_2058[5]) *
                                                 local_2058[2]) * 8) =
                                                     *(undefined8 *)
                                                      (*local_2058 +
                                                      ((long)(local_2144 - (int)local_2058[4]) +
                                                       (long)(local_2140 -
                                                             *(int *)((long)local_2058 + 0x24)) *
                                                       local_2058[1] +
                                                      (long)(local_1c34 - (int)local_2058[5]) *
                                                      local_2058[2]) * 8);
                                              }
                                            }
                                            else {
                                              local_1bfc = (local_2144 + -1) - local_2094;
                                              local_1bf8 = local_2058;
                                              local_1c00 = local_2140;
                                              local_1c04 = local_213c;
                                              local_1c10 = local_2058;
                                              local_1c14 = local_2144;
                                              local_1c18 = local_2140;
                                              local_1c1c = local_213c;
                                              *(undefined8 *)
                                               (*local_2058 +
                                               ((long)(local_2144 - (int)local_2058[4]) +
                                                (long)(local_2140 -
                                                      *(int *)((long)local_2058 + 0x24)) *
                                                local_2058[1] +
                                               (long)(local_213c - (int)local_2058[5]) *
                                               local_2058[2]) * 8) =
                                                   *(undefined8 *)
                                                    (*local_2058 +
                                                    ((long)(local_1bfc - (int)local_2058[4]) +
                                                     (long)(local_2140 -
                                                           *(int *)((long)local_2058 + 0x24)) *
                                                     local_2058[1] +
                                                    (long)(local_213c - (int)local_2058[5]) *
                                                    local_2058[2]) * 8);
                                            }
                                          }
                                          else {
LAB_0135c272:
                                            if ((local_2140 == local_20a0._4_4_ + -1) &&
                                               (local_213c == local_2098 + -1)) {
                                              local_ab8 = local_2068;
                                              local_abc = 1;
                                              if ((local_2068[1] & 1) == 0) {
                                                local_ac8 = local_2068;
                                                local_acc = 2;
                                                if ((local_2068[2] & 1) == 0) goto LAB_0135c6e3;
                                              }
                                              local_ad8 = local_2068;
                                              local_adc = 1;
                                              if ((local_2068[1] & 1) != 0) {
                                                local_ae8 = local_2068;
                                                local_aec = 2;
                                                if ((local_2068[2] & 1) != 0) {
                                                  local_1c60 = local_2140 + 1 + local_2094;
                                                  local_1c64 = local_213c + 1 + local_2094;
                                                  local_1c58 = local_2058;
                                                  local_1c5c = local_2144;
                                                  local_1c70 = local_2058;
                                                  local_1c74 = local_2144;
                                                  local_1c78 = local_2140;
                                                  local_1c7c = local_213c;
                                                  *(undefined8 *)
                                                   (*local_2058 +
                                                   ((long)(local_2144 - (int)local_2058[4]) +
                                                    (long)(local_2140 -
                                                          *(int *)((long)local_2058 + 0x24)) *
                                                    local_2058[1] +
                                                   (long)(local_213c - (int)local_2058[5]) *
                                                   local_2058[2]) * 8) =
                                                       *(undefined8 *)
                                                        (*local_2058 +
                                                        ((long)(local_2144 - (int)local_2058[4]) +
                                                         (long)(local_1c60 -
                                                               *(int *)((long)local_2058 + 0x24)) *
                                                         local_2058[1] +
                                                        (long)(local_1c64 - (int)local_2058[5]) *
                                                        local_2058[2]) * 8);
                                                  goto LAB_0135dc21;
                                                }
                                              }
                                              local_af8 = local_2068;
                                              local_afc = 1;
                                              if ((local_2068[1] & 1) == 0) {
                                                local_b08 = local_2068;
                                                local_b0c = 2;
                                                if ((local_2068[2] & 1) != 0) {
                                                  local_1cc4 = local_213c + 1 + local_2094;
                                                  local_1cb8 = local_2058;
                                                  local_1cbc = local_2144;
                                                  local_1cc0 = local_2140;
                                                  local_1cd0 = local_2058;
                                                  local_1cd4 = local_2144;
                                                  local_1cd8 = local_2140;
                                                  local_1cdc = local_213c;
                                                  *(undefined8 *)
                                                   (*local_2058 +
                                                   ((long)(local_2144 - (int)local_2058[4]) +
                                                    (long)(local_2140 -
                                                          *(int *)((long)local_2058 + 0x24)) *
                                                    local_2058[1] +
                                                   (long)(local_213c - (int)local_2058[5]) *
                                                   local_2058[2]) * 8) =
                                                       *(undefined8 *)
                                                        (*local_2058 +
                                                        ((long)(local_2144 - (int)local_2058[4]) +
                                                         (long)(local_2140 -
                                                               *(int *)((long)local_2058 + 0x24)) *
                                                         local_2058[1] +
                                                        (long)(local_1cc4 - (int)local_2058[5]) *
                                                        local_2058[2]) * 8);
                                                }
                                              }
                                              else {
                                                local_1c90 = local_2140 + 1 + local_2094;
                                                local_1c88 = local_2058;
                                                local_1c8c = local_2144;
                                                local_1c94 = local_213c;
                                                local_1ca0 = local_2058;
                                                local_1ca4 = local_2144;
                                                local_1ca8 = local_2140;
                                                local_1cac = local_213c;
                                                *(undefined8 *)
                                                 (*local_2058 +
                                                 ((long)(local_2144 - (int)local_2058[4]) +
                                                  (long)(local_2140 -
                                                        *(int *)((long)local_2058 + 0x24)) *
                                                  local_2058[1] +
                                                 (long)(local_213c - (int)local_2058[5]) *
                                                 local_2058[2]) * 8) =
                                                     *(undefined8 *)
                                                      (*local_2058 +
                                                      ((long)(local_2144 - (int)local_2058[4]) +
                                                       (long)(local_1c90 -
                                                             *(int *)((long)local_2058 + 0x24)) *
                                                       local_2058[1] +
                                                      (long)(local_213c - (int)local_2058[5]) *
                                                      local_2058[2]) * 8);
                                              }
                                            }
                                            else {
LAB_0135c6e3:
                                              if ((local_2140 == local_20c0._4_4_ + 1) &&
                                                 (local_213c == local_2098 + -1)) {
                                                local_b18 = local_2070;
                                                local_b1c = 1;
                                                if ((local_2070[1] & 1) == 0) {
                                                  local_b28 = local_2068;
                                                  local_b2c = 2;
                                                  if ((local_2068[2] & 1) == 0) goto LAB_0135cb54;
                                                }
                                                local_b38 = local_2070;
                                                local_b3c = 1;
                                                if ((local_2070[1] & 1) != 0) {
                                                  local_b48 = local_2068;
                                                  local_b4c = 2;
                                                  if ((local_2068[2] & 1) != 0) {
                                                    local_1cf0 = (local_2140 + -1) - local_2094;
                                                    local_1cf4 = local_213c + 1 + local_2094;
                                                    local_1ce8 = local_2058;
                                                    local_1cec = local_2144;
                                                    local_1d00 = local_2058;
                                                    local_1d04 = local_2144;
                                                    local_1d08 = local_2140;
                                                    local_1d0c = local_213c;
                                                    *(undefined8 *)
                                                     (*local_2058 +
                                                     ((long)(local_2144 - (int)local_2058[4]) +
                                                      (long)(local_2140 -
                                                            *(int *)((long)local_2058 + 0x24)) *
                                                      local_2058[1] +
                                                     (long)(local_213c - (int)local_2058[5]) *
                                                     local_2058[2]) * 8) =
                                                         *(undefined8 *)
                                                          (*local_2058 +
                                                          ((long)(local_2144 - (int)local_2058[4]) +
                                                           (long)(local_1cf0 -
                                                                 *(int *)((long)local_2058 + 0x24))
                                                           * local_2058[1] +
                                                          (long)(local_1cf4 - (int)local_2058[5]) *
                                                          local_2058[2]) * 8);
                                                    goto LAB_0135dc21;
                                                  }
                                                }
                                                local_b58 = local_2070;
                                                local_b5c = 1;
                                                if ((local_2070[1] & 1) == 0) {
                                                  local_b68 = local_2068;
                                                  local_b6c = 2;
                                                  if ((local_2068[2] & 1) != 0) {
                                                    local_1d54 = local_213c + 1 + local_2094;
                                                    local_1d48 = local_2058;
                                                    local_1d4c = local_2144;
                                                    local_1d50 = local_2140;
                                                    local_1d60 = local_2058;
                                                    local_1d64 = local_2144;
                                                    local_1d68 = local_2140;
                                                    local_1d6c = local_213c;
                                                    *(undefined8 *)
                                                     (*local_2058 +
                                                     ((long)(local_2144 - (int)local_2058[4]) +
                                                      (long)(local_2140 -
                                                            *(int *)((long)local_2058 + 0x24)) *
                                                      local_2058[1] +
                                                     (long)(local_213c - (int)local_2058[5]) *
                                                     local_2058[2]) * 8) =
                                                         *(undefined8 *)
                                                          (*local_2058 +
                                                          ((long)(local_2144 - (int)local_2058[4]) +
                                                           (long)(local_2140 -
                                                                 *(int *)((long)local_2058 + 0x24))
                                                           * local_2058[1] +
                                                          (long)(local_1d54 - (int)local_2058[5]) *
                                                          local_2058[2]) * 8);
                                                  }
                                                }
                                                else {
                                                  local_1d20 = (local_2140 + -1) - local_2094;
                                                  local_1d18 = local_2058;
                                                  local_1d1c = local_2144;
                                                  local_1d24 = local_213c;
                                                  local_1d30 = local_2058;
                                                  local_1d34 = local_2144;
                                                  local_1d38 = local_2140;
                                                  local_1d3c = local_213c;
                                                  *(undefined8 *)
                                                   (*local_2058 +
                                                   ((long)(local_2144 - (int)local_2058[4]) +
                                                    (long)(local_2140 -
                                                          *(int *)((long)local_2058 + 0x24)) *
                                                    local_2058[1] +
                                                   (long)(local_213c - (int)local_2058[5]) *
                                                   local_2058[2]) * 8) =
                                                       *(undefined8 *)
                                                        (*local_2058 +
                                                        ((long)(local_2144 - (int)local_2058[4]) +
                                                         (long)(local_1d20 -
                                                               *(int *)((long)local_2058 + 0x24)) *
                                                         local_2058[1] +
                                                        (long)(local_213c - (int)local_2058[5]) *
                                                        local_2058[2]) * 8);
                                                }
                                              }
                                              else {
LAB_0135cb54:
                                                if ((local_2140 == local_20a0._4_4_ + -1) &&
                                                   (local_213c == local_20b8 + 1)) {
                                                  local_b78 = local_2068;
                                                  local_b7c = 1;
                                                  if ((local_2068[1] & 1) == 0) {
                                                    local_b88 = local_2070;
                                                    local_b8c = 2;
                                                    if ((local_2070[2] & 1) == 0) goto LAB_0135cfc5;
                                                  }
                                                  local_b98 = local_2068;
                                                  local_b9c = 1;
                                                  if ((local_2068[1] & 1) != 0) {
                                                    local_ba8 = local_2070;
                                                    local_bac = 2;
                                                    if ((local_2070[2] & 1) != 0) {
                                                      local_1d80 = local_2140 + 1 + local_2094;
                                                      local_1d84 = (local_213c + -1) - local_2094;
                                                      local_1d78 = local_2058;
                                                      local_1d7c = local_2144;
                                                      local_1d90 = local_2058;
                                                      local_1d94 = local_2144;
                                                      local_1d98 = local_2140;
                                                      local_1d9c = local_213c;
                                                      *(undefined8 *)
                                                       (*local_2058 +
                                                       ((long)(local_2144 - (int)local_2058[4]) +
                                                        (long)(local_2140 -
                                                              *(int *)((long)local_2058 + 0x24)) *
                                                        local_2058[1] +
                                                       (long)(local_213c - (int)local_2058[5]) *
                                                       local_2058[2]) * 8) =
                                                           *(undefined8 *)
                                                            (*local_2058 +
                                                            ((long)(local_2144 - (int)local_2058[4])
                                                             + (long)(local_1d80 -
                                                                     *(int *)((long)local_2058 +
                                                                             0x24)) * local_2058[1]
                                                            + (long)(local_1d84 - (int)local_2058[5]
                                                                    ) * local_2058[2]) * 8);
                                                      goto LAB_0135dc21;
                                                    }
                                                  }
                                                  local_bb8 = local_2068;
                                                  local_bbc = 1;
                                                  if ((local_2068[1] & 1) == 0) {
                                                    local_bc8 = local_2070;
                                                    local_bcc = 2;
                                                    if ((local_2070[2] & 1) != 0) {
                                                      local_1de4 = (local_213c + -1) - local_2094;
                                                      local_1dd8 = local_2058;
                                                      local_1ddc = local_2144;
                                                      local_1de0 = local_2140;
                                                      local_1df0 = local_2058;
                                                      local_1df4 = local_2144;
                                                      local_1df8 = local_2140;
                                                      local_1dfc = local_213c;
                                                      *(undefined8 *)
                                                       (*local_2058 +
                                                       ((long)(local_2144 - (int)local_2058[4]) +
                                                        (long)(local_2140 -
                                                              *(int *)((long)local_2058 + 0x24)) *
                                                        local_2058[1] +
                                                       (long)(local_213c - (int)local_2058[5]) *
                                                       local_2058[2]) * 8) =
                                                           *(undefined8 *)
                                                            (*local_2058 +
                                                            ((long)(local_2144 - (int)local_2058[4])
                                                             + (long)(local_2140 -
                                                                     *(int *)((long)local_2058 +
                                                                             0x24)) * local_2058[1]
                                                            + (long)(local_1de4 - (int)local_2058[5]
                                                                    ) * local_2058[2]) * 8);
                                                    }
                                                  }
                                                  else {
                                                    local_1db0 = local_2140 + 1 + local_2094;
                                                    local_1da8 = local_2058;
                                                    local_1dac = local_2144;
                                                    local_1db4 = local_213c;
                                                    local_1dc0 = local_2058;
                                                    local_1dc4 = local_2144;
                                                    local_1dc8 = local_2140;
                                                    local_1dcc = local_213c;
                                                    *(undefined8 *)
                                                     (*local_2058 +
                                                     ((long)(local_2144 - (int)local_2058[4]) +
                                                      (long)(local_2140 -
                                                            *(int *)((long)local_2058 + 0x24)) *
                                                      local_2058[1] +
                                                     (long)(local_213c - (int)local_2058[5]) *
                                                     local_2058[2]) * 8) =
                                                         *(undefined8 *)
                                                          (*local_2058 +
                                                          ((long)(local_2144 - (int)local_2058[4]) +
                                                           (long)(local_1db0 -
                                                                 *(int *)((long)local_2058 + 0x24))
                                                           * local_2058[1] +
                                                          (long)(local_213c - (int)local_2058[5]) *
                                                          local_2058[2]) * 8);
                                                  }
                                                }
                                                else {
LAB_0135cfc5:
                                                  if ((local_2140 == local_20c0._4_4_ + 1) &&
                                                     (local_213c == local_20b8 + 1)) {
                                                    local_bd8 = local_2070;
                                                    local_bdc = 1;
                                                    if ((local_2070[1] & 1) == 0) {
                                                      local_be8 = local_2070;
                                                      local_bec = 2;
                                                      if ((local_2070[2] & 1) == 0)
                                                      goto LAB_0135d436;
                                                    }
                                                    local_bf8 = local_2070;
                                                    local_bfc = 1;
                                                    if ((local_2070[1] & 1) != 0) {
                                                      local_c08 = local_2070;
                                                      local_c0c = 2;
                                                      if ((local_2070[2] & 1) != 0) {
                                                        local_1e10 = (local_2140 + -1) - local_2094;
                                                        local_1e14 = (local_213c + -1) - local_2094;
                                                        local_1e08 = local_2058;
                                                        local_1e0c = local_2144;
                                                        local_1e20 = local_2058;
                                                        local_1e24 = local_2144;
                                                        local_1e28 = local_2140;
                                                        local_1e2c = local_213c;
                                                        *(undefined8 *)
                                                         (*local_2058 +
                                                         ((long)(local_2144 - (int)local_2058[4]) +
                                                          (long)(local_2140 -
                                                                *(int *)((long)local_2058 + 0x24)) *
                                                          local_2058[1] +
                                                         (long)(local_213c - (int)local_2058[5]) *
                                                         local_2058[2]) * 8) =
                                                             *(undefined8 *)
                                                              (*local_2058 +
                                                              ((long)(local_2144 -
                                                                     (int)local_2058[4]) +
                                                               (long)(local_1e10 -
                                                                     *(int *)((long)local_2058 +
                                                                             0x24)) * local_2058[1]
                                                              + (long)(local_1e14 -
                                                                      (int)local_2058[5]) *
                                                                local_2058[2]) * 8);
                                                        goto LAB_0135dc21;
                                                      }
                                                    }
                                                    local_c18 = local_2070;
                                                    local_c1c = 1;
                                                    if ((local_2070[1] & 1) == 0) {
                                                      local_c28 = local_2070;
                                                      local_c2c = 2;
                                                      if ((local_2070[2] & 1) != 0) {
                                                        local_1e74 = (local_213c + -1) - local_2094;
                                                        local_1e68 = local_2058;
                                                        local_1e6c = local_2144;
                                                        local_1e70 = local_2140;
                                                        local_1e80 = local_2058;
                                                        local_1e84 = local_2144;
                                                        local_1e88 = local_2140;
                                                        local_1e8c = local_213c;
                                                        *(undefined8 *)
                                                         (*local_2058 +
                                                         ((long)(local_2144 - (int)local_2058[4]) +
                                                          (long)(local_2140 -
                                                                *(int *)((long)local_2058 + 0x24)) *
                                                          local_2058[1] +
                                                         (long)(local_213c - (int)local_2058[5]) *
                                                         local_2058[2]) * 8) =
                                                             *(undefined8 *)
                                                              (*local_2058 +
                                                              ((long)(local_2144 -
                                                                     (int)local_2058[4]) +
                                                               (long)(local_2140 -
                                                                     *(int *)((long)local_2058 +
                                                                             0x24)) * local_2058[1]
                                                              + (long)(local_1e74 -
                                                                      (int)local_2058[5]) *
                                                                local_2058[2]) * 8);
                                                      }
                                                    }
                                                    else {
                                                      local_1e40 = (local_2140 + -1) - local_2094;
                                                      local_1e38 = local_2058;
                                                      local_1e3c = local_2144;
                                                      local_1e44 = local_213c;
                                                      local_1e50 = local_2058;
                                                      local_1e54 = local_2144;
                                                      local_1e58 = local_2140;
                                                      local_1e5c = local_213c;
                                                      *(undefined8 *)
                                                       (*local_2058 +
                                                       ((long)(local_2144 - (int)local_2058[4]) +
                                                        (long)(local_2140 -
                                                              *(int *)((long)local_2058 + 0x24)) *
                                                        local_2058[1] +
                                                       (long)(local_213c - (int)local_2058[5]) *
                                                       local_2058[2]) * 8) =
                                                           *(undefined8 *)
                                                            (*local_2058 +
                                                            ((long)(local_2144 - (int)local_2058[4])
                                                             + (long)(local_1e40 -
                                                                     *(int *)((long)local_2058 +
                                                                             0x24)) * local_2058[1]
                                                            + (long)(local_213c - (int)local_2058[5]
                                                                    ) * local_2058[2]) * 8);
                                                    }
                                                  }
                                                  else {
LAB_0135d436:
                                                    if (local_2144 == (int)local_20a0 + -1) {
                                                      local_c38 = local_2068;
                                                      local_c3c = 0;
                                                      if ((*local_2068 & 1) != 0) {
                                                        local_1e9c = local_2144 + 1 + local_2094;
                                                        local_1e98 = local_2058;
                                                        local_1ea0 = local_2140;
                                                        local_1ea4 = local_213c;
                                                        local_1eb0 = local_2058;
                                                        local_1eb4 = local_2144;
                                                        local_1eb8 = local_2140;
                                                        local_1ebc = local_213c;
                                                        *(undefined8 *)
                                                         (*local_2058 +
                                                         ((long)(local_2144 - (int)local_2058[4]) +
                                                          (long)(local_2140 -
                                                                *(int *)((long)local_2058 + 0x24)) *
                                                          local_2058[1] +
                                                         (long)(local_213c - (int)local_2058[5]) *
                                                         local_2058[2]) * 8) =
                                                             *(undefined8 *)
                                                              (*local_2058 +
                                                              ((long)(local_1e9c -
                                                                     (int)local_2058[4]) +
                                                               (long)(local_2140 -
                                                                     *(int *)((long)local_2058 +
                                                                             0x24)) * local_2058[1]
                                                              + (long)(local_213c -
                                                                      (int)local_2058[5]) *
                                                                local_2058[2]) * 8);
                                                        goto LAB_0135dc21;
                                                      }
                                                    }
                                                    if (local_2144 == (int)local_20c0 + 1) {
                                                      local_c48 = local_2070;
                                                      local_c4c = 0;
                                                      if ((*local_2070 & 1) != 0) {
                                                        local_1ecc = (local_2144 + -1) - local_2094;
                                                        local_1ec8 = local_2058;
                                                        local_1ed0 = local_2140;
                                                        local_1ed4 = local_213c;
                                                        local_1ee0 = local_2058;
                                                        local_1ee4 = local_2144;
                                                        local_1ee8 = local_2140;
                                                        local_1eec = local_213c;
                                                        *(undefined8 *)
                                                         (*local_2058 +
                                                         ((long)(local_2144 - (int)local_2058[4]) +
                                                          (long)(local_2140 -
                                                                *(int *)((long)local_2058 + 0x24)) *
                                                          local_2058[1] +
                                                         (long)(local_213c - (int)local_2058[5]) *
                                                         local_2058[2]) * 8) =
                                                             *(undefined8 *)
                                                              (*local_2058 +
                                                              ((long)(local_1ecc -
                                                                     (int)local_2058[4]) +
                                                               (long)(local_2140 -
                                                                     *(int *)((long)local_2058 +
                                                                             0x24)) * local_2058[1]
                                                              + (long)(local_213c -
                                                                      (int)local_2058[5]) *
                                                                local_2058[2]) * 8);
                                                        goto LAB_0135dc21;
                                                      }
                                                    }
                                                    if (local_2140 == local_20a0._4_4_ + -1) {
                                                      local_c58 = local_2068;
                                                      local_c5c = 1;
                                                      if ((local_2068[1] & 1) != 0) {
                                                        local_1f00 = local_2140 + 1 + local_2094;
                                                        local_1ef8 = local_2058;
                                                        local_1efc = local_2144;
                                                        local_1f04 = local_213c;
                                                        local_1f10 = local_2058;
                                                        local_1f14 = local_2144;
                                                        local_1f18 = local_2140;
                                                        local_1f1c = local_213c;
                                                        *(undefined8 *)
                                                         (*local_2058 +
                                                         ((long)(local_2144 - (int)local_2058[4]) +
                                                          (long)(local_2140 -
                                                                *(int *)((long)local_2058 + 0x24)) *
                                                          local_2058[1] +
                                                         (long)(local_213c - (int)local_2058[5]) *
                                                         local_2058[2]) * 8) =
                                                             *(undefined8 *)
                                                              (*local_2058 +
                                                              ((long)(local_2144 -
                                                                     (int)local_2058[4]) +
                                                               (long)(local_1f00 -
                                                                     *(int *)((long)local_2058 +
                                                                             0x24)) * local_2058[1]
                                                              + (long)(local_213c -
                                                                      (int)local_2058[5]) *
                                                                local_2058[2]) * 8);
                                                        goto LAB_0135dc21;
                                                      }
                                                    }
                                                    if (local_2140 == local_20c0._4_4_ + 1) {
                                                      local_c68 = local_2070;
                                                      local_c6c = 1;
                                                      if ((local_2070[1] & 1) != 0) {
                                                        local_1f30 = (local_2140 + -1) - local_2094;
                                                        local_1f28 = local_2058;
                                                        local_1f2c = local_2144;
                                                        local_1f34 = local_213c;
                                                        local_1f40 = local_2058;
                                                        local_1f44 = local_2144;
                                                        local_1f48 = local_2140;
                                                        local_1f4c = local_213c;
                                                        *(undefined8 *)
                                                         (*local_2058 +
                                                         ((long)(local_2144 - (int)local_2058[4]) +
                                                          (long)(local_2140 -
                                                                *(int *)((long)local_2058 + 0x24)) *
                                                          local_2058[1] +
                                                         (long)(local_213c - (int)local_2058[5]) *
                                                         local_2058[2]) * 8) =
                                                             *(undefined8 *)
                                                              (*local_2058 +
                                                              ((long)(local_2144 -
                                                                     (int)local_2058[4]) +
                                                               (long)(local_1f30 -
                                                                     *(int *)((long)local_2058 +
                                                                             0x24)) * local_2058[1]
                                                              + (long)(local_213c -
                                                                      (int)local_2058[5]) *
                                                                local_2058[2]) * 8);
                                                        goto LAB_0135dc21;
                                                      }
                                                    }
                                                    if (local_213c == local_2098 + -1) {
                                                      local_c78 = local_2068;
                                                      local_c7c = 2;
                                                      if ((local_2068[2] & 1) != 0) {
                                                        local_1f64 = local_213c + 1 + local_2094;
                                                        local_1f58 = local_2058;
                                                        local_1f5c = local_2144;
                                                        local_1f60 = local_2140;
                                                        local_1f70 = local_2058;
                                                        local_1f74 = local_2144;
                                                        local_1f78 = local_2140;
                                                        local_1f7c = local_213c;
                                                        *(undefined8 *)
                                                         (*local_2058 +
                                                         ((long)(local_2144 - (int)local_2058[4]) +
                                                          (long)(local_2140 -
                                                                *(int *)((long)local_2058 + 0x24)) *
                                                          local_2058[1] +
                                                         (long)(local_213c - (int)local_2058[5]) *
                                                         local_2058[2]) * 8) =
                                                             *(undefined8 *)
                                                              (*local_2058 +
                                                              ((long)(local_2144 -
                                                                     (int)local_2058[4]) +
                                                               (long)(local_2140 -
                                                                     *(int *)((long)local_2058 +
                                                                             0x24)) * local_2058[1]
                                                              + (long)(local_1f64 -
                                                                      (int)local_2058[5]) *
                                                                local_2058[2]) * 8);
                                                        goto LAB_0135dc21;
                                                      }
                                                    }
                                                    if (local_213c == local_20b8 + 1) {
                                                      local_c88 = local_2070;
                                                      local_c8c = 2;
                                                      if ((local_2070[2] & 1) != 0) {
                                                        local_1f94 = (local_213c + -1) - local_2094;
                                                        local_1f88 = local_2058;
                                                        local_1f8c = local_2144;
                                                        local_1f90 = local_2140;
                                                        local_1fa0 = local_2058;
                                                        local_1fa4 = local_2144;
                                                        local_1fa8 = local_2140;
                                                        local_1fac = local_213c;
                                                        *(undefined8 *)
                                                         (*local_2058 +
                                                         ((long)(local_2144 - (int)local_2058[4]) +
                                                          (long)(local_2140 -
                                                                *(int *)((long)local_2058 + 0x24)) *
                                                          local_2058[1] +
                                                         (long)(local_213c - (int)local_2058[5]) *
                                                         local_2058[2]) * 8) =
                                                             *(undefined8 *)
                                                              (*local_2058 +
                                                              ((long)(local_2144 -
                                                                     (int)local_2058[4]) +
                                                               (long)(local_2140 -
                                                                     *(int *)((long)local_2058 +
                                                                             0x24)) * local_2058[1]
                                                              + (long)(local_1f94 -
                                                                      (int)local_2058[5]) *
                                                                local_2058[2]) * 8);
                                                      }
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
LAB_0135dc21:
        }
      }
    }
  }
  return;
}

Assistant:

inline void mlndlap_bc_doit (Box const& vbx, Array4<T> const& a, Box const& domain,
                             GpuArray<bool,AMREX_SPACEDIM> const& bflo,
                             GpuArray<bool,AMREX_SPACEDIM> const& bfhi) noexcept
{
    Box gdomain = domain;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (! bflo[idim]) gdomain.growLo(idim,1);
        if (! bfhi[idim]) gdomain.growHi(idim,1);
    }

    if (gdomain.strictly_contains(vbx)) return;

    const int offset = domain.cellCentered() ? 0 : 1;

    const auto dlo = amrex::lbound(domain);
    const auto dhi = amrex::ubound(domain);

    Box const& sbox = amrex::grow(vbx,1);
    AMREX_HOST_DEVICE_FOR_3D(sbox, i, j, k,
    {
        if (! gdomain.contains(IntVect(i,j,k))) {
            // xlo & ylo & zlo
            if (i == dlo.x-1 && j == dlo.y-1 && k == dlo.z-1 && (bflo[0] || bflo[1] || bflo[2]))
            {
                if (bflo[0] && bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k+1+offset);
                }
                else if (bflo[0] && bflo[1])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k);
                }
                else if (bflo[0] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k+1+offset);
                }
                else if (bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k+1+offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xhi & ylo & zlo
            else if (i == dhi.x+1 && j == dlo.y-1 && k == dlo.z-1 && (bfhi[0] || bflo[1] || bflo[2]))
            {
                if (bfhi[0] && bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k+1+offset);
                }
                else if (bfhi[0] && bflo[1])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k);
                }
                else if (bfhi[0] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k+1+offset);
                }
                else if (bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k+1+offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xlo & yhi & zlo
            else if (i == dlo.x-1 && j == dhi.y+1 && k == dlo.z-1 && (bflo[0] || bfhi[1] || bflo[2]))
            {
                if (bflo[0] && bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k+1+offset);
                }
                else if (bflo[0] && bfhi[1])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k);
                }
                else if (bflo[0] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k+1+offset);
                }
                else if (bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k+1+offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xhi & yhi & zlo
            else if (i == dhi.x+1 && j == dhi.y+1 && k == dlo.z-1 && (bfhi[0] || bfhi[1] || bflo[2]))
            {
                if (bfhi[0] && bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k+1+offset);
                }
                else if (bfhi[0] && bfhi[1])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k);
                }
                else if (bfhi[0] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k+1+offset);
                }
                else if (bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k+1+offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xlo & ylo & zhi
            else if (i == dlo.x-1 && j == dlo.y-1 && k == dhi.z+1 && (bflo[0] || bflo[1] || bfhi[2]))
            {
                if (bflo[0] && bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k-1-offset);
                }
                else if (bflo[0] && bflo[1])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k);
                }
                else if (bflo[0] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k-1-offset);
                }
                else if (bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k-1-offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xhi & ylo & zhi
            else if (i == dhi.x+1 && j == dlo.y-1 && k == dhi.z+1 && (bfhi[0] || bflo[1] || bfhi[2]))
            {
                if (bfhi[0] && bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k-1-offset);
                }
                else if (bfhi[0] && bflo[1])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k);
                }
                else if (bfhi[0] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k-1-offset);
                }
                else if (bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k-1-offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xlo & yhi & zhi
            else if (i == dlo.x-1 && j == dhi.y+1 && k == dhi.z+1 && (bflo[0] || bfhi[1] || bfhi[2]))
            {
                if (bflo[0] && bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k-1-offset);
                }
                else if (bflo[0] && bfhi[1])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k);
                }
                else if (bflo[0] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k-1-offset);
                }
                else if (bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k-1-offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xhi & yhi & zhi
            else if (i == dhi.x+1 && j == dhi.y+1 && k == dhi.z+1 && (bfhi[0] || bfhi[1] || bfhi[2]))
            {
                if (bfhi[0] && bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k-1-offset);
                }
                else if (bfhi[0] && bfhi[1])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k);
                }
                else if (bfhi[0] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k-1-offset);
                }
                else if (bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k-1-offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xlo & ylo
            else if (i == dlo.x-1 && j == dlo.y-1 && (bflo[0] || bflo[1]))
            {
                if (bflo[0] && bflo[1])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
            }
            // xhi & ylo
            else if (i == dhi.x+1 && j == dlo.y-1 && (bfhi[0] || bflo[1]))
            {
                if (bfhi[0] && bflo[1])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
            }
            // xlo & yhi
            else if (i == dlo.x-1 && j == dhi.y+1 && (bflo[0] || bfhi[1]))
            {
                if (bflo[0] && bfhi[1])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
            }
            // xhi & yhi
            else if (i == dhi.x+1 && j == dhi.y+1 && (bfhi[0] || bfhi[1]))
            {
                if (bfhi[0] && bfhi[1])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
            }
            // xlo & zlo
            else if (i == dlo.x-1 && k == dlo.z-1 && (bflo[0] || bflo[2]))
            {
                if (bflo[0] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k+1+offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xhi & zlo
            else if (i == dhi.x+1 && k == dlo.z-1 && (bfhi[0] || bflo[2]))
            {
                if (bfhi[0] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k+1+offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xlo & zhi
            else if (i == dlo.x-1 && k == dhi.z+1 && (bflo[0] || bfhi[2]))
            {
                if (bflo[0] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k-1-offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xhi & zhi
            else if (i == dhi.x+1 && k == dhi.z+1 && (bfhi[0] || bfhi[2]))
            {
                if (bfhi[0] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k-1-offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // ylo & zlo
            else if (j == dlo.y-1 && k == dlo.z-1 && (bflo[1] || bflo[2]))
            {
                if (bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k+1+offset);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // yhi & zlo
            else if (j == dhi.y+1 && k == dlo.z-1 && (bfhi[1] || bflo[2]))
            {
                if (bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k+1+offset);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // ylo & zhi
            else if (j == dlo.y-1 && k == dhi.z+1 && (bflo[1] || bfhi[2]))
            {
                if (bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k-1-offset);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // yhi & zhi
            else if (j == dhi.y+1 && k == dhi.z+1 && (bfhi[1] || bfhi[2]))
            {
                if (bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k-1-offset);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            else if (i == dlo.x-1 && bflo[0])
            {
                a(i,j,k) = a(i+1+offset, j, k);
            }
            else if (i == dhi.x+1 && bfhi[0])
            {
                a(i,j,k) = a(i-1-offset, j, k);
            }
            else if (j == dlo.y-1 && bflo[1])
            {
                a(i,j,k) = a(i, j+1+offset, k);
            }
            else if (j == dhi.y+1 && bfhi[1])
            {
                a(i,j,k) = a(i, j-1-offset, k);
            }
            else if (k == dlo.z-1 && bflo[2])
            {
                a(i,j,k) = a(i, j, k+1+offset);
            }
            else if (k == dhi.z+1 && bfhi[2])
            {
                a(i,j,k) = a(i, j, k-1-offset);
            }
        }
    });
}